

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  byte bVar32;
  uint uVar33;
  ulong uVar34;
  long lVar36;
  uint uVar37;
  long lVar38;
  ulong uVar39;
  uint uVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  ulong uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar69 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  int iVar105;
  float fVar106;
  undefined4 uVar107;
  vint4 bi_2;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  vint4 bi_1;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  vint4 bi;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  vfloat4 a0;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  vint4 ai_2;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  vint4 ai_1;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  vint4 ai;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar175;
  float fVar184;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar185;
  float fVar200;
  float fVar201;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar202;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  vfloat4 a0_3;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  float fVar217;
  float fVar226;
  float fVar227;
  vfloat4 b0_2;
  undefined1 auVar218 [16];
  float fVar228;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  vfloat4 a0_4;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 in_ZMM18 [64];
  undefined1 auVar261 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_480;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  uint auStack_430 [4];
  undefined1 local_420 [32];
  undefined1 local_400 [16];
  undefined1 local_3f0 [8];
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar35;
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  float fVar133;
  float fVar142;
  float fVar143;
  float fVar158;
  float fVar159;
  float fVar174;
  
  PVar6 = prim[1];
  uVar34 = (ulong)(byte)PVar6;
  lVar36 = uVar34 * 0x25;
  fVar106 = *(float *)(prim + lVar36 + 0x12);
  auVar46 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar46 = vinsertps_avx(auVar46,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar47 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar47 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar46 = vsubps_avx(auVar46,*(undefined1 (*) [16])(prim + lVar36 + 6));
  auVar70._0_4_ = fVar106 * auVar46._0_4_;
  auVar70._4_4_ = fVar106 * auVar46._4_4_;
  auVar70._8_4_ = fVar106 * auVar46._8_4_;
  auVar70._12_4_ = fVar106 * auVar46._12_4_;
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar34 * 4 + 6)));
  auVar50._0_4_ = fVar106 * auVar47._0_4_;
  auVar50._4_4_ = fVar106 * auVar47._4_4_;
  auVar50._8_4_ = fVar106 * auVar47._8_4_;
  auVar50._12_4_ = fVar106 * auVar47._12_4_;
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar34 * 5 + 6)));
  auVar47 = vcvtdq2ps_avx(auVar47);
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar34 * 6 + 6)));
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar34 * 0xf + 6)));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar34 + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar34 * 0x1a + 6)));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar59 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar34 * 0x1b + 6)));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar34 * 0x1c + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar144._4_4_ = auVar50._0_4_;
  auVar144._0_4_ = auVar50._0_4_;
  auVar144._8_4_ = auVar50._0_4_;
  auVar144._12_4_ = auVar50._0_4_;
  auVar65 = vshufps_avx(auVar50,auVar50,0x55);
  auVar66 = vshufps_avx(auVar50,auVar50,0xaa);
  fVar106 = auVar66._0_4_;
  auVar63._0_4_ = fVar106 * auVar57._0_4_;
  fVar231 = auVar66._4_4_;
  auVar63._4_4_ = fVar231 * auVar57._4_4_;
  fVar217 = auVar66._8_4_;
  auVar63._8_4_ = fVar217 * auVar57._8_4_;
  fVar226 = auVar66._12_4_;
  auVar63._12_4_ = fVar226 * auVar57._12_4_;
  auVar55._0_4_ = auVar61._0_4_ * fVar106;
  auVar55._4_4_ = auVar61._4_4_ * fVar231;
  auVar55._8_4_ = auVar61._8_4_ * fVar217;
  auVar55._12_4_ = auVar61._12_4_ * fVar226;
  auVar49._0_4_ = auVar64._0_4_ * fVar106;
  auVar49._4_4_ = auVar64._4_4_ * fVar231;
  auVar49._8_4_ = auVar64._8_4_ * fVar217;
  auVar49._12_4_ = auVar64._12_4_ * fVar226;
  auVar66 = vfmadd231ps_fma(auVar63,auVar65,auVar47);
  auVar20 = vfmadd231ps_fma(auVar55,auVar65,auVar60);
  auVar65 = vfmadd231ps_fma(auVar49,auVar59,auVar65);
  auVar21 = vfmadd231ps_fma(auVar66,auVar144,auVar46);
  auVar20 = vfmadd231ps_fma(auVar20,auVar144,auVar56);
  auVar67 = vfmadd231ps_fma(auVar65,auVar58,auVar144);
  auVar248._4_4_ = auVar70._0_4_;
  auVar248._0_4_ = auVar70._0_4_;
  auVar248._8_4_ = auVar70._0_4_;
  auVar248._12_4_ = auVar70._0_4_;
  auVar65 = vshufps_avx(auVar70,auVar70,0x55);
  auVar66 = vshufps_avx(auVar70,auVar70,0xaa);
  fVar106 = auVar66._0_4_;
  auVar145._0_4_ = fVar106 * auVar57._0_4_;
  fVar231 = auVar66._4_4_;
  auVar145._4_4_ = fVar231 * auVar57._4_4_;
  fVar217 = auVar66._8_4_;
  auVar145._8_4_ = fVar217 * auVar57._8_4_;
  fVar226 = auVar66._12_4_;
  auVar145._12_4_ = fVar226 * auVar57._12_4_;
  auVar72._0_4_ = auVar61._0_4_ * fVar106;
  auVar72._4_4_ = auVar61._4_4_ * fVar231;
  auVar72._8_4_ = auVar61._8_4_ * fVar217;
  auVar72._12_4_ = auVar61._12_4_ * fVar226;
  auVar71._0_4_ = auVar64._0_4_ * fVar106;
  auVar71._4_4_ = auVar64._4_4_ * fVar231;
  auVar71._8_4_ = auVar64._8_4_ * fVar217;
  auVar71._12_4_ = auVar64._12_4_ * fVar226;
  auVar47 = vfmadd231ps_fma(auVar145,auVar65,auVar47);
  auVar57 = vfmadd231ps_fma(auVar72,auVar65,auVar60);
  auVar60 = vfmadd231ps_fma(auVar71,auVar65,auVar59);
  auVar48 = vfmadd231ps_fma(auVar47,auVar248,auVar46);
  auVar50 = vfmadd231ps_fma(auVar57,auVar248,auVar56);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar265 = ZEXT1664(auVar46);
  auVar49 = vfmadd231ps_fma(auVar60,auVar248,auVar58);
  auVar47 = vandps_avx512vl(auVar21,auVar46);
  auVar176._8_4_ = 0x219392ef;
  auVar176._0_8_ = 0x219392ef219392ef;
  auVar176._12_4_ = 0x219392ef;
  uVar45 = vcmpps_avx512vl(auVar47,auVar176,1);
  bVar43 = (bool)((byte)uVar45 & 1);
  auVar51._0_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar21._0_4_;
  bVar43 = (bool)((byte)(uVar45 >> 1) & 1);
  auVar51._4_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar21._4_4_;
  bVar43 = (bool)((byte)(uVar45 >> 2) & 1);
  auVar51._8_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar21._8_4_;
  bVar43 = (bool)((byte)(uVar45 >> 3) & 1);
  auVar51._12_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar21._12_4_;
  auVar47 = vandps_avx512vl(auVar20,auVar46);
  uVar45 = vcmpps_avx512vl(auVar47,auVar176,1);
  bVar43 = (bool)((byte)uVar45 & 1);
  auVar52._0_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar20._0_4_;
  bVar43 = (bool)((byte)(uVar45 >> 1) & 1);
  auVar52._4_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar20._4_4_;
  bVar43 = (bool)((byte)(uVar45 >> 2) & 1);
  auVar52._8_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar20._8_4_;
  bVar43 = (bool)((byte)(uVar45 >> 3) & 1);
  auVar52._12_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar20._12_4_;
  auVar46 = vandps_avx512vl(auVar67,auVar46);
  uVar45 = vcmpps_avx512vl(auVar46,auVar176,1);
  bVar43 = (bool)((byte)uVar45 & 1);
  auVar53._0_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar67._0_4_;
  bVar43 = (bool)((byte)(uVar45 >> 1) & 1);
  auVar53._4_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar67._4_4_;
  bVar43 = (bool)((byte)(uVar45 >> 2) & 1);
  auVar53._8_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar67._8_4_;
  bVar43 = (bool)((byte)(uVar45 >> 3) & 1);
  auVar53._12_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar67._12_4_;
  auVar47 = vrcp14ps_avx512vl(auVar51);
  auVar177._8_4_ = 0x3f800000;
  auVar177._0_8_ = 0x3f8000003f800000;
  auVar177._12_4_ = 0x3f800000;
  auVar46 = vfnmadd213ps_fma(auVar51,auVar47,auVar177);
  auVar21 = vfmadd132ps_fma(auVar46,auVar47,auVar47);
  auVar47 = vrcp14ps_avx512vl(auVar52);
  auVar46 = vfnmadd213ps_fma(auVar52,auVar47,auVar177);
  auVar67 = vfmadd132ps_fma(auVar46,auVar47,auVar47);
  auVar47 = vrcp14ps_avx512vl(auVar53);
  auVar46 = vfnmadd213ps_fma(auVar53,auVar47,auVar177);
  auVar68 = vfmadd132ps_fma(auVar46,auVar47,auVar47);
  fVar106 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar36 + 0x16)) *
            *(float *)(prim + lVar36 + 0x1a);
  auVar160._4_4_ = fVar106;
  auVar160._0_4_ = fVar106;
  auVar160._8_4_ = fVar106;
  auVar160._12_4_ = fVar106;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar34 * 7 + 6);
  auVar46 = vpmovsxwd_avx(auVar46);
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar34 * 0xb + 6);
  auVar47 = vpmovsxwd_avx(auVar47);
  auVar47 = vcvtdq2ps_avx(auVar47);
  auVar56 = vsubps_avx(auVar47,auVar46);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar34 * 9 + 6);
  auVar47 = vpmovsxwd_avx(auVar57);
  auVar57 = vfmadd213ps_fma(auVar56,auVar160,auVar46);
  auVar46 = vcvtdq2ps_avx(auVar47);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar34 * 0xd + 6);
  auVar47 = vpmovsxwd_avx(auVar56);
  auVar47 = vcvtdq2ps_avx(auVar47);
  auVar47 = vsubps_avx(auVar47,auVar46);
  auVar56 = vfmadd213ps_fma(auVar47,auVar160,auVar46);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + uVar34 * 0x12 + 6);
  auVar46 = vpmovsxwd_avx(auVar60);
  auVar46 = vcvtdq2ps_avx(auVar46);
  uVar45 = (ulong)(uint)((int)(uVar34 * 5) << 2);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar34 * 2 + uVar45 + 6);
  auVar47 = vpmovsxwd_avx(auVar61);
  auVar47 = vcvtdq2ps_avx(auVar47);
  auVar47 = vsubps_avx(auVar47,auVar46);
  auVar60 = vfmadd213ps_fma(auVar47,auVar160,auVar46);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar45 + 6);
  auVar46 = vpmovsxwd_avx(auVar58);
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar34 * 0x18 + 6);
  auVar47 = vpmovsxwd_avx(auVar59);
  auVar47 = vcvtdq2ps_avx(auVar47);
  auVar47 = vsubps_avx(auVar47,auVar46);
  auVar61 = vfmadd213ps_fma(auVar47,auVar160,auVar46);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar34 * 0x1d + 6);
  auVar46 = vpmovsxwd_avx(auVar64);
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar34 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar47 = vpmovsxwd_avx(auVar65);
  auVar47 = vcvtdq2ps_avx(auVar47);
  auVar47 = vsubps_avx(auVar47,auVar46);
  auVar58 = vfmadd213ps_fma(auVar47,auVar160,auVar46);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar34) + 6);
  auVar46 = vpmovsxwd_avx(auVar66);
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar34 * 0x23 + 6);
  auVar47 = vpmovsxwd_avx(auVar20);
  auVar47 = vcvtdq2ps_avx(auVar47);
  auVar47 = vsubps_avx(auVar47,auVar46);
  auVar47 = vfmadd213ps_fma(auVar47,auVar160,auVar46);
  auVar46 = vsubps_avx(auVar57,auVar48);
  auVar161._0_4_ = auVar21._0_4_ * auVar46._0_4_;
  auVar161._4_4_ = auVar21._4_4_ * auVar46._4_4_;
  auVar161._8_4_ = auVar21._8_4_ * auVar46._8_4_;
  auVar161._12_4_ = auVar21._12_4_ * auVar46._12_4_;
  auVar46 = vsubps_avx(auVar56,auVar48);
  auVar69._0_4_ = auVar21._0_4_ * auVar46._0_4_;
  auVar69._4_4_ = auVar21._4_4_ * auVar46._4_4_;
  auVar69._8_4_ = auVar21._8_4_ * auVar46._8_4_;
  auVar69._12_4_ = auVar21._12_4_ * auVar46._12_4_;
  auVar46 = vsubps_avx(auVar60,auVar50);
  auVar146._0_4_ = auVar67._0_4_ * auVar46._0_4_;
  auVar146._4_4_ = auVar67._4_4_ * auVar46._4_4_;
  auVar146._8_4_ = auVar67._8_4_ * auVar46._8_4_;
  auVar146._12_4_ = auVar67._12_4_ * auVar46._12_4_;
  auVar46 = vsubps_avx(auVar61,auVar50);
  auVar62._0_4_ = auVar67._0_4_ * auVar46._0_4_;
  auVar62._4_4_ = auVar67._4_4_ * auVar46._4_4_;
  auVar62._8_4_ = auVar67._8_4_ * auVar46._8_4_;
  auVar62._12_4_ = auVar67._12_4_ * auVar46._12_4_;
  auVar46 = vsubps_avx(auVar58,auVar49);
  auVar134._0_4_ = auVar68._0_4_ * auVar46._0_4_;
  auVar134._4_4_ = auVar68._4_4_ * auVar46._4_4_;
  auVar134._8_4_ = auVar68._8_4_ * auVar46._8_4_;
  auVar134._12_4_ = auVar68._12_4_ * auVar46._12_4_;
  auVar46 = vsubps_avx(auVar47,auVar49);
  auVar54._0_4_ = auVar68._0_4_ * auVar46._0_4_;
  auVar54._4_4_ = auVar68._4_4_ * auVar46._4_4_;
  auVar54._8_4_ = auVar68._8_4_ * auVar46._8_4_;
  auVar54._12_4_ = auVar68._12_4_ * auVar46._12_4_;
  auVar46 = vpminsd_avx(auVar161,auVar69);
  auVar47 = vpminsd_avx(auVar146,auVar62);
  auVar46 = vmaxps_avx(auVar46,auVar47);
  auVar47 = vpminsd_avx(auVar134,auVar54);
  uVar107 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar21._4_4_ = uVar107;
  auVar21._0_4_ = uVar107;
  auVar21._8_4_ = uVar107;
  auVar21._12_4_ = uVar107;
  auVar47 = vmaxps_avx512vl(auVar47,auVar21);
  auVar46 = vmaxps_avx(auVar46,auVar47);
  auVar67._8_4_ = 0x3f7ffffa;
  auVar67._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar67._12_4_ = 0x3f7ffffa;
  local_400 = vmulps_avx512vl(auVar46,auVar67);
  auVar46 = vpmaxsd_avx(auVar161,auVar69);
  auVar47 = vpmaxsd_avx(auVar146,auVar62);
  auVar46 = vminps_avx(auVar46,auVar47);
  auVar47 = vpmaxsd_avx(auVar134,auVar54);
  uVar107 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar68._4_4_ = uVar107;
  auVar68._0_4_ = uVar107;
  auVar68._8_4_ = uVar107;
  auVar68._12_4_ = uVar107;
  auVar47 = vminps_avx512vl(auVar47,auVar68);
  auVar46 = vminps_avx(auVar46,auVar47);
  auVar48._8_4_ = 0x3f800003;
  auVar48._0_8_ = 0x3f8000033f800003;
  auVar48._12_4_ = 0x3f800003;
  auVar46 = vmulps_avx512vl(auVar46,auVar48);
  auVar47 = vpbroadcastd_avx512vl();
  uVar18 = vcmpps_avx512vl(local_400,auVar46,2);
  uVar45 = vpcmpgtd_avx512vl(auVar47,_DAT_01f7fcf0);
  uVar45 = ((byte)uVar18 & 0xf) & uVar45;
  if ((char)uVar45 != '\0') {
    local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar46 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
    auVar261 = ZEXT1664(auVar46);
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar264 = ZEXT1664(auVar46);
    do {
      lVar36 = 0;
      for (uVar34 = uVar45; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
        lVar36 = lVar36 + 1;
      }
      uVar40 = *(uint *)(prim + 2);
      pGVar9 = (context->scene->geometries).items[uVar40].ptr;
      fVar106 = (pGVar9->time_range).lower;
      fVar106 = pGVar9->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar106) / ((pGVar9->time_range).upper - fVar106)
                );
      auVar46 = vroundss_avx(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106),9);
      uVar7 = *(uint *)(prim + lVar36 * 4 + 6);
      auVar47 = vaddss_avx512f(ZEXT416((uint)pGVar9->fnumTimeSegments),
                               SUB6416(ZEXT464(0xbf800000),0));
      auVar46 = vminss_avx(auVar46,auVar47);
      auVar48 = vmaxss_avx512f(auVar261._0_16_,auVar46);
      uVar34 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                               (ulong)uVar7 *
                               pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar38 = (long)(int)auVar48._0_4_ * 0x38;
      lVar11 = *(long *)(_Var10 + lVar38);
      lVar12 = *(long *)(_Var10 + 0x10 + lVar38);
      auVar46 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar34);
      lVar36 = uVar34 + 1;
      auVar47 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar36);
      lVar1 = uVar34 + 2;
      auVar57 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
      lVar2 = uVar34 + 3;
      auVar56 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
      lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
      lVar12 = *(long *)(lVar11 + lVar38);
      lVar13 = *(long *)(lVar11 + 0x10 + lVar38);
      auVar60 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar34);
      auVar61 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar36);
      auVar58 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
      auVar59 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
      lVar12 = *(long *)(_Var10 + 0x38 + lVar38);
      lVar13 = *(long *)(_Var10 + 0x48 + lVar38);
      auVar64 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar34);
      auVar65 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar36);
      auVar66 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
      auVar20 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
      lVar12 = *(long *)(lVar11 + 0x38 + lVar38);
      lVar11 = *(long *)(lVar11 + 0x48 + lVar38);
      auVar21 = *(undefined1 (*) [16])(lVar12 + uVar34 * lVar11);
      auVar67 = *(undefined1 (*) [16])(lVar12 + lVar36 * lVar11);
      auVar68 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar11);
      auVar49 = vsubss_avx512f(ZEXT416((uint)fVar106),auVar48);
      auVar108._0_12_ = ZEXT812(0);
      auVar108._12_4_ = 0;
      auVar48 = vmulps_avx512vl(auVar56,auVar108);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar57,auVar108);
      auVar50 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar47,auVar48);
      auVar51 = vaddps_avx512vl(auVar46,auVar50);
      auVar69 = auVar264._0_16_;
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar47,auVar69);
      auVar52 = vfnmadd231ps_avx512vl(auVar48,auVar46,auVar69);
      auVar126._0_4_ = auVar59._0_4_ * 0.0;
      auVar126._4_4_ = auVar59._4_4_ * 0.0;
      auVar126._8_4_ = auVar59._8_4_ * 0.0;
      auVar126._12_4_ = auVar59._12_4_ * 0.0;
      auVar48 = vfmadd231ps_fma(auVar126,auVar58,auVar108);
      auVar50 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
      auVar50 = vfmadd213ps_avx512vl(auVar50,auVar61,auVar48);
      auVar53 = vaddps_avx512vl(auVar60,auVar50);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar61,auVar69);
      auVar54 = vfnmadd231ps_avx512vl(auVar48,auVar60,auVar69);
      auVar48 = vxorps_avx512vl(auVar50,auVar50);
      auVar48 = vfmadd213ps_avx512vl(auVar48,auVar57,auVar56);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar47,auVar108);
      auVar55 = vfmadd231ps_avx512vl(auVar48,auVar46,auVar108);
      auVar56 = vmulps_avx512vl(auVar56,auVar69);
      auVar57 = vfnmadd231ps_avx512vl(auVar56,auVar69,auVar57);
      auVar47 = vfmadd231ps_fma(auVar57,auVar108,auVar47);
      auVar50 = vfnmadd231ps_fma(auVar47,auVar108,auVar46);
      auVar46 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar58,auVar59);
      auVar46 = vfmadd231ps_fma(auVar46,auVar61,auVar108);
      auVar48 = vfmadd231ps_fma(auVar46,auVar60,auVar108);
      auVar46 = vmulps_avx512vl(auVar59,auVar69);
      auVar46 = vfnmadd231ps_avx512vl(auVar46,auVar69,auVar58);
      auVar46 = vfmadd231ps_fma(auVar46,auVar108,auVar61);
      auVar61 = vfnmadd231ps_fma(auVar46,auVar108,auVar60);
      auVar47 = vshufps_avx512vl(auVar52,auVar52,0xc9);
      auVar46 = vshufps_avx512vl(auVar53,auVar53,0xc9);
      auVar46 = vmulps_avx512vl(auVar52,auVar46);
      auVar46 = vfmsub231ps_avx512vl(auVar46,auVar47,auVar53);
      auVar57 = vshufps_avx(auVar46,auVar46,0xc9);
      auVar46 = vshufps_avx(auVar54,auVar54,0xc9);
      auVar46 = vmulps_avx512vl(auVar52,auVar46);
      auVar46 = vfmsub231ps_fma(auVar46,auVar47,auVar54);
      auVar56 = vshufps_avx(auVar46,auVar46,0xc9);
      auVar46 = vshufps_avx(auVar50,auVar50,0xc9);
      auVar47 = vshufps_avx(auVar48,auVar48,0xc9);
      auVar162._0_4_ = auVar50._0_4_ * auVar47._0_4_;
      auVar162._4_4_ = auVar50._4_4_ * auVar47._4_4_;
      auVar162._8_4_ = auVar50._8_4_ * auVar47._8_4_;
      auVar162._12_4_ = auVar50._12_4_ * auVar47._12_4_;
      auVar47 = vfmsub231ps_fma(auVar162,auVar46,auVar48);
      auVar60 = vshufps_avx(auVar47,auVar47,0xc9);
      auVar47 = vshufps_avx(auVar61,auVar61,0xc9);
      auVar163._0_4_ = auVar50._0_4_ * auVar47._0_4_;
      auVar163._4_4_ = auVar50._4_4_ * auVar47._4_4_;
      auVar163._8_4_ = auVar50._8_4_ * auVar47._8_4_;
      auVar163._12_4_ = auVar50._12_4_ * auVar47._12_4_;
      auVar46 = vfmsub231ps_fma(auVar163,auVar46,auVar61);
      auVar61 = vshufps_avx(auVar46,auVar46,0xc9);
      auVar46 = vdpps_avx(auVar57,auVar57,0x7f);
      auVar47 = vrsqrt14ss_avx512f(auVar108,ZEXT416(auVar46._0_4_));
      auVar58 = vmulss_avx512f(auVar47,ZEXT416(0x3fc00000));
      auVar59 = vmulss_avx512f(auVar46,ZEXT416(0x3f000000));
      auVar59 = vmulss_avx512f(auVar59,auVar47);
      auVar47 = vmulss_avx512f(auVar59,ZEXT416((uint)(auVar47._0_4_ * auVar47._0_4_)));
      fVar217 = auVar58._0_4_ - auVar47._0_4_;
      auVar186._4_4_ = fVar217;
      auVar186._0_4_ = fVar217;
      auVar186._8_4_ = fVar217;
      auVar186._12_4_ = fVar217;
      auVar47 = vdpps_avx(auVar57,auVar56,0x7f);
      auVar58 = vmulps_avx512vl(auVar57,auVar186);
      auVar59 = vbroadcastss_avx512vl(auVar46);
      auVar56 = vmulps_avx512vl(auVar59,auVar56);
      fVar106 = auVar47._0_4_;
      auVar147._0_4_ = fVar106 * auVar57._0_4_;
      auVar147._4_4_ = fVar106 * auVar57._4_4_;
      auVar147._8_4_ = fVar106 * auVar57._8_4_;
      auVar147._12_4_ = fVar106 * auVar57._12_4_;
      auVar57 = vsubps_avx(auVar56,auVar147);
      auVar47 = vrcp14ss_avx512f(auVar108,ZEXT416(auVar46._0_4_));
      auVar46 = vfnmadd213ss_avx512f(auVar46,auVar47,ZEXT416(0x40000000));
      fVar106 = auVar47._0_4_ * auVar46._0_4_;
      auVar46 = vdpps_avx(auVar60,auVar60,0x7f);
      auVar47 = vrsqrt14ss_avx512f(auVar108,ZEXT416(auVar46._0_4_));
      auVar56 = vmulss_avx512f(auVar47,ZEXT416(0x3fc00000));
      auVar59 = vmulss_avx512f(auVar46,ZEXT416(0x3f000000));
      fVar231 = auVar47._0_4_;
      fVar226 = auVar56._0_4_ - auVar59._0_4_ * fVar231 * fVar231 * fVar231;
      auVar187._0_4_ = auVar60._0_4_ * fVar226;
      auVar187._4_4_ = auVar60._4_4_ * fVar226;
      auVar187._8_4_ = auVar60._8_4_ * fVar226;
      auVar187._12_4_ = auVar60._12_4_ * fVar226;
      auVar47 = vdpps_avx(auVar60,auVar61,0x7f);
      auVar56 = vbroadcastss_avx512vl(auVar46);
      auVar56 = vmulps_avx512vl(auVar56,auVar61);
      fVar231 = auVar47._0_4_;
      auVar115._0_4_ = fVar231 * auVar60._0_4_;
      auVar115._4_4_ = fVar231 * auVar60._4_4_;
      auVar115._8_4_ = fVar231 * auVar60._8_4_;
      auVar115._12_4_ = fVar231 * auVar60._12_4_;
      auVar47 = vsubps_avx(auVar56,auVar115);
      auVar56 = vrcp14ss_avx512f(auVar108,ZEXT416(auVar46._0_4_));
      auVar46 = vfnmadd213ss_avx512f(auVar46,auVar56,ZEXT416(0x40000000));
      fVar231 = auVar56._0_4_ * auVar46._0_4_;
      auVar46 = vshufps_avx512vl(auVar51,auVar51,0xff);
      auVar56 = vmulps_avx512vl(auVar46,auVar58);
      auVar59 = vsubps_avx512vl(auVar51,auVar56);
      auVar60 = vshufps_avx512vl(auVar52,auVar52,0xff);
      auVar60 = vmulps_avx512vl(auVar60,auVar58);
      auVar135._0_4_ = auVar60._0_4_ + auVar46._0_4_ * fVar217 * fVar106 * auVar57._0_4_;
      auVar135._4_4_ = auVar60._4_4_ + auVar46._4_4_ * fVar217 * fVar106 * auVar57._4_4_;
      auVar135._8_4_ = auVar60._8_4_ + auVar46._8_4_ * fVar217 * fVar106 * auVar57._8_4_;
      auVar135._12_4_ = auVar60._12_4_ + auVar46._12_4_ * fVar217 * fVar106 * auVar57._12_4_;
      auVar57 = vsubps_avx512vl(auVar52,auVar135);
      auVar48 = vaddps_avx512vl(auVar51,auVar56);
      auVar56 = vaddps_avx512vl(auVar52,auVar135);
      auVar46 = vshufps_avx512vl(auVar55,auVar55,0xff);
      auVar60 = vmulps_avx512vl(auVar46,auVar187);
      auVar51 = vsubps_avx512vl(auVar55,auVar60);
      auVar61 = vshufps_avx512vl(auVar50,auVar50,0xff);
      auVar58 = vmulps_avx512vl(auVar61,auVar187);
      auVar188._0_4_ = auVar58._0_4_ + auVar46._0_4_ * fVar226 * auVar47._0_4_ * fVar231;
      auVar188._4_4_ = auVar58._4_4_ + auVar46._4_4_ * fVar226 * auVar47._4_4_ * fVar231;
      auVar188._8_4_ = auVar58._8_4_ + auVar46._8_4_ * fVar226 * auVar47._8_4_ * fVar231;
      auVar188._12_4_ = auVar58._12_4_ + auVar46._12_4_ * fVar226 * auVar47._12_4_ * fVar231;
      auVar46 = vsubps_avx(auVar50,auVar188);
      auVar52 = vaddps_avx512vl(auVar55,auVar60);
      auVar60 = vaddps_avx512vl(auVar50,auVar188);
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
      auVar47 = vmulps_avx512vl(auVar57,auVar50);
      auVar178._0_4_ = auVar59._0_4_ + auVar47._0_4_;
      auVar178._4_4_ = auVar59._4_4_ + auVar47._4_4_;
      auVar178._8_4_ = auVar59._8_4_ + auVar47._8_4_;
      auVar178._12_4_ = auVar59._12_4_ + auVar47._12_4_;
      auVar46 = vmulps_avx512vl(auVar46,auVar50);
      auVar58 = vsubps_avx(auVar51,auVar46);
      auVar46 = vmulps_avx512vl(auVar56,auVar50);
      auVar53 = vaddps_avx512vl(auVar48,auVar46);
      auVar46 = vmulps_avx512vl(auVar60,auVar50);
      auVar54 = vsubps_avx512vl(auVar52,auVar46);
      auVar46 = *(undefined1 (*) [16])(lVar12 + lVar11 * lVar2);
      auVar47 = vmulps_avx512vl(auVar20,auVar108);
      auVar47 = vfmadd231ps_fma(auVar47,auVar66,auVar108);
      auVar57 = vxorps_avx512vl(auVar60,auVar60);
      auVar57 = vfmadd213ps_avx512vl(auVar57,auVar65,auVar47);
      auVar55 = vaddps_avx512vl(auVar64,auVar57);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar65,auVar69);
      auVar62 = vfnmadd231ps_avx512vl(auVar47,auVar64,auVar69);
      auVar47 = vmulps_avx512vl(auVar46,auVar108);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar68,auVar108);
      auVar57 = vxorps_avx512vl(auVar61,auVar61);
      auVar57 = vfmadd213ps_avx512vl(auVar57,auVar67,auVar47);
      auVar56 = vaddps_avx512vl(auVar21,auVar57);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar67,auVar69);
      auVar60 = vfnmadd231ps_avx512vl(auVar47,auVar21,auVar69);
      auVar47 = vxorps_avx512vl(auVar57,auVar57);
      auVar47 = vfmadd213ps_avx512vl(auVar47,auVar66,auVar20);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar65,auVar108);
      auVar63 = vfmadd231ps_avx512vl(auVar47,auVar64,auVar108);
      auVar47 = vmulps_avx512vl(auVar20,auVar69);
      auVar47 = vfnmadd231ps_avx512vl(auVar47,auVar69,auVar66);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar108,auVar65);
      auVar64 = vfnmadd231ps_avx512vl(auVar47,auVar108,auVar64);
      auVar47 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar68,auVar46);
      auVar47 = vfmadd231ps_fma(auVar47,auVar67,auVar108);
      auVar47 = vfmadd231ps_fma(auVar47,auVar21,auVar108);
      auVar46 = vmulps_avx512vl(auVar46,auVar69);
      auVar46 = vfnmadd231ps_avx512vl(auVar46,auVar69,auVar68);
      auVar46 = vfmadd231ps_fma(auVar46,auVar108,auVar67);
      auVar61 = vfnmadd231ps_fma(auVar46,auVar108,auVar21);
      auVar46 = vshufps_avx(auVar62,auVar62,0xc9);
      auVar57 = vshufps_avx512vl(auVar56,auVar56,0xc9);
      fVar226 = auVar62._0_4_;
      auVar232._0_4_ = fVar226 * auVar57._0_4_;
      fVar227 = auVar62._4_4_;
      auVar232._4_4_ = fVar227 * auVar57._4_4_;
      fVar133 = auVar62._8_4_;
      auVar232._8_4_ = fVar133 * auVar57._8_4_;
      fVar142 = auVar62._12_4_;
      auVar232._12_4_ = fVar142 * auVar57._12_4_;
      auVar57 = vfmsub231ps_avx512vl(auVar232,auVar46,auVar56);
      auVar57 = vshufps_avx(auVar57,auVar57,0xc9);
      auVar56 = vshufps_avx512vl(auVar60,auVar60,0xc9);
      auVar242._0_4_ = fVar226 * auVar56._0_4_;
      auVar242._4_4_ = fVar227 * auVar56._4_4_;
      auVar242._8_4_ = fVar133 * auVar56._8_4_;
      auVar242._12_4_ = fVar142 * auVar56._12_4_;
      auVar46 = vfmsub231ps_avx512vl(auVar242,auVar46,auVar60);
      auVar56 = vshufps_avx(auVar46,auVar46,0xc9);
      auVar65 = vshufps_avx512vl(auVar64,auVar64,0xc9);
      auVar46 = vshufps_avx(auVar47,auVar47,0xc9);
      auVar46 = vmulps_avx512vl(auVar64,auVar46);
      auVar46 = vfmsub231ps_fma(auVar46,auVar65,auVar47);
      auVar60 = vshufps_avx(auVar46,auVar46,0xc9);
      auVar47 = vshufps_avx(auVar61,auVar61,0xc9);
      auVar46 = vdpps_avx(auVar57,auVar57,0x7f);
      auVar47 = vmulps_avx512vl(auVar64,auVar47);
      auVar47 = vfmsub231ps_fma(auVar47,auVar65,auVar61);
      auVar61 = vshufps_avx(auVar47,auVar47,0xc9);
      auVar47 = vrsqrt14ss_avx512f(auVar108,ZEXT416(auVar46._0_4_));
      auVar65 = vmulss_avx512f(auVar47,ZEXT416(0x3fc00000));
      auVar66 = vmulss_avx512f(auVar46,ZEXT416(0x3f000000));
      auVar66 = vmulss_avx512f(auVar66,auVar47);
      auVar47 = vmulss_avx512f(auVar66,ZEXT416((uint)(auVar47._0_4_ * auVar47._0_4_)));
      auVar47 = vsubss_avx512f(auVar65,auVar47);
      auVar254._0_4_ = auVar47._0_4_;
      auVar254._4_4_ = auVar254._0_4_;
      auVar254._8_4_ = auVar254._0_4_;
      auVar254._12_4_ = auVar254._0_4_;
      auVar65 = vmulps_avx512vl(auVar57,auVar254);
      auVar47 = vdpps_avx(auVar57,auVar56,0x7f);
      auVar66 = vbroadcastss_avx512vl(auVar46);
      auVar56 = vmulps_avx512vl(auVar66,auVar56);
      fVar106 = auVar47._0_4_;
      auVar164._0_4_ = auVar57._0_4_ * fVar106;
      auVar164._4_4_ = auVar57._4_4_ * fVar106;
      auVar164._8_4_ = auVar57._8_4_ * fVar106;
      auVar164._12_4_ = auVar57._12_4_ * fVar106;
      auVar57 = vsubps_avx(auVar56,auVar164);
      auVar47 = vrcp14ss_avx512f(auVar108,ZEXT416(auVar46._0_4_));
      auVar46 = vfnmadd213ss_avx512f(auVar46,auVar47,ZEXT416(0x40000000));
      fVar106 = auVar47._0_4_ * auVar46._0_4_;
      auVar46 = vdpps_avx(auVar60,auVar60,0x7f);
      auVar47 = vrsqrt14ss_avx512f(auVar108,ZEXT416(auVar46._0_4_));
      auVar56 = vmulss_avx512f(auVar47,ZEXT416(0x3fc00000));
      auVar66 = vmulss_avx512f(auVar46,ZEXT416(0x3f000000));
      fVar231 = auVar47._0_4_;
      fVar217 = auVar56._0_4_ - auVar66._0_4_ * fVar231 * fVar231 * fVar231;
      auVar249._0_4_ = auVar60._0_4_ * fVar217;
      auVar249._4_4_ = auVar60._4_4_ * fVar217;
      auVar249._8_4_ = auVar60._8_4_ * fVar217;
      auVar249._12_4_ = auVar60._12_4_ * fVar217;
      auVar47 = vdpps_avx(auVar60,auVar61,0x7f);
      auVar56 = vbroadcastss_avx512vl(auVar46);
      auVar56 = vmulps_avx512vl(auVar56,auVar61);
      fVar231 = auVar47._0_4_;
      auVar211._0_4_ = auVar60._0_4_ * fVar231;
      auVar211._4_4_ = auVar60._4_4_ * fVar231;
      auVar211._8_4_ = auVar60._8_4_ * fVar231;
      auVar211._12_4_ = auVar60._12_4_ * fVar231;
      auVar47 = vsubps_avx(auVar56,auVar211);
      auVar56 = vrcp14ss_avx512f(auVar108,ZEXT416(auVar46._0_4_));
      auVar46 = vfnmadd213ss_avx512f(auVar46,auVar56,ZEXT416(0x40000000));
      auVar67 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      fVar231 = auVar46._0_4_ * auVar56._0_4_;
      auVar56 = vshufps_avx512vl(auVar55,auVar55,0xff);
      auVar60 = vmulps_avx512vl(auVar56,auVar65);
      auVar61 = vsubps_avx512vl(auVar55,auVar60);
      auVar46 = vshufps_avx(auVar62,auVar62,0xff);
      auVar46 = vmulps_avx512vl(auVar46,auVar65);
      auVar148._0_4_ = auVar46._0_4_ + auVar56._0_4_ * auVar254._0_4_ * fVar106 * auVar57._0_4_;
      auVar148._4_4_ = auVar46._4_4_ + auVar56._4_4_ * auVar254._0_4_ * fVar106 * auVar57._4_4_;
      auVar148._8_4_ = auVar46._8_4_ + auVar56._8_4_ * auVar254._0_4_ * fVar106 * auVar57._8_4_;
      auVar148._12_4_ = auVar46._12_4_ + auVar56._12_4_ * auVar254._0_4_ * fVar106 * auVar57._12_4_;
      auVar46 = vsubps_avx(auVar62,auVar148);
      auVar57 = vaddps_avx512vl(auVar55,auVar60);
      auVar149._0_4_ = fVar226 + auVar148._0_4_;
      auVar149._4_4_ = fVar227 + auVar148._4_4_;
      auVar149._8_4_ = fVar133 + auVar148._8_4_;
      auVar149._12_4_ = fVar142 + auVar148._12_4_;
      auVar56 = vshufps_avx512vl(auVar63,auVar63,0xff);
      auVar243._0_4_ = auVar56._0_4_ * auVar249._0_4_;
      auVar243._4_4_ = auVar56._4_4_ * auVar249._4_4_;
      auVar243._8_4_ = auVar56._8_4_ * auVar249._8_4_;
      auVar243._12_4_ = auVar56._12_4_ * auVar249._12_4_;
      auVar60 = vsubps_avx512vl(auVar63,auVar243);
      auVar65 = vshufps_avx512vl(auVar64,auVar64,0xff);
      auVar65 = vmulps_avx512vl(auVar65,auVar249);
      auVar165._0_4_ = auVar65._0_4_ + auVar56._0_4_ * fVar217 * auVar47._0_4_ * fVar231;
      auVar165._4_4_ = auVar65._4_4_ + auVar56._4_4_ * fVar217 * auVar47._4_4_ * fVar231;
      auVar165._8_4_ = auVar65._8_4_ + auVar56._8_4_ * fVar217 * auVar47._8_4_ * fVar231;
      auVar165._12_4_ = auVar65._12_4_ + auVar56._12_4_ * fVar217 * auVar47._12_4_ * fVar231;
      auVar47 = vsubps_avx512vl(auVar64,auVar165);
      auVar56 = vaddps_avx512vl(auVar63,auVar243);
      auVar64 = vaddps_avx512vl(auVar64,auVar165);
      auVar46 = vmulps_avx512vl(auVar46,auVar50);
      auVar212._0_4_ = auVar61._0_4_ + auVar46._0_4_;
      auVar212._4_4_ = auVar61._4_4_ + auVar46._4_4_;
      auVar212._8_4_ = auVar61._8_4_ + auVar46._8_4_;
      auVar212._12_4_ = auVar61._12_4_ + auVar46._12_4_;
      auVar46 = vmulps_avx512vl(auVar47,auVar50);
      auVar46 = vsubps_avx(auVar60,auVar46);
      auVar47 = vmulps_avx512vl(auVar149,auVar50);
      auVar150._0_4_ = auVar57._0_4_ + auVar47._0_4_;
      auVar150._4_4_ = auVar57._4_4_ + auVar47._4_4_;
      auVar150._8_4_ = auVar57._8_4_ + auVar47._8_4_;
      auVar150._12_4_ = auVar57._12_4_ + auVar47._12_4_;
      auVar47 = vmulps_avx512vl(auVar64,auVar50);
      auVar267 = ZEXT464(0x3f800000);
      auVar47 = vsubps_avx(auVar56,auVar47);
      auVar64 = vbroadcastss_avx512vl(auVar49);
      auVar65 = vsubss_avx512f(ZEXT416(0x3f800000),auVar49);
      auVar109._0_4_ = auVar65._0_4_;
      auVar109._4_4_ = auVar109._0_4_;
      auVar109._8_4_ = auVar109._0_4_;
      auVar109._12_4_ = auVar109._0_4_;
      auVar61 = vmulps_avx512vl(auVar64,auVar61);
      auVar65 = vmulps_avx512vl(auVar64,auVar212);
      auVar46 = vmulps_avx512vl(auVar64,auVar46);
      auVar255._0_4_ = auVar64._0_4_ * auVar60._0_4_;
      auVar255._4_4_ = auVar64._4_4_ * auVar60._4_4_;
      auVar255._8_4_ = auVar64._8_4_ * auVar60._8_4_;
      auVar255._12_4_ = auVar64._12_4_ * auVar60._12_4_;
      local_340 = vfmadd231ps_avx512vl(auVar61,auVar109,auVar59);
      local_350 = vfmadd231ps_avx512vl(auVar65,auVar109,auVar178);
      local_360 = vfmadd231ps_avx512vl(auVar46,auVar109,auVar58);
      local_370 = vfmadd231ps_fma(auVar255,auVar109,auVar51);
      auVar46 = vmulps_avx512vl(auVar64,auVar57);
      auVar57 = vmulps_avx512vl(auVar64,auVar150);
      auVar47 = vmulps_avx512vl(auVar64,auVar47);
      auVar244._0_4_ = auVar64._0_4_ * auVar56._0_4_;
      auVar244._4_4_ = auVar64._4_4_ * auVar56._4_4_;
      auVar244._8_4_ = auVar64._8_4_ * auVar56._8_4_;
      auVar244._12_4_ = auVar64._12_4_ * auVar56._12_4_;
      _local_380 = vfmadd231ps_avx512vl(auVar46,auVar109,auVar48);
      _local_390 = vfmadd231ps_avx512vl(auVar57,auVar109,auVar53);
      _local_3a0 = vfmadd231ps_avx512vl(auVar47,auVar109,auVar54);
      _local_3b0 = vfmadd231ps_fma(auVar244,auVar109,auVar52);
      auVar46 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar46 = vinsertps_avx(auVar46,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      fVar106 = *(float *)(ray + k * 4 + 0x60);
      local_2c0 = vsubps_avx512vl(local_340,auVar46);
      uVar107 = local_2c0._0_4_;
      auVar116._4_4_ = uVar107;
      auVar116._0_4_ = uVar107;
      auVar116._8_4_ = uVar107;
      auVar116._12_4_ = uVar107;
      auVar47 = vshufps_avx(local_2c0,local_2c0,0x55);
      auVar57 = vshufps_avx(local_2c0,local_2c0,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar231 = pre->ray_space[k].vz.field_0.m128[0];
      fVar217 = pre->ray_space[k].vz.field_0.m128[1];
      fVar226 = pre->ray_space[k].vz.field_0.m128[2];
      fVar227 = pre->ray_space[k].vz.field_0.m128[3];
      auVar110._0_4_ = fVar231 * auVar57._0_4_;
      auVar110._4_4_ = fVar217 * auVar57._4_4_;
      auVar110._8_4_ = fVar226 * auVar57._8_4_;
      auVar110._12_4_ = fVar227 * auVar57._12_4_;
      auVar47 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar5,auVar47);
      auVar61 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar4,auVar116);
      local_2d0 = vsubps_avx512vl(local_350,auVar46);
      uVar107 = local_2d0._0_4_;
      auVar120._4_4_ = uVar107;
      auVar120._0_4_ = uVar107;
      auVar120._8_4_ = uVar107;
      auVar120._12_4_ = uVar107;
      auVar47 = vshufps_avx(local_2d0,local_2d0,0x55);
      auVar57 = vshufps_avx(local_2d0,local_2d0,0xaa);
      auVar117._0_4_ = fVar231 * auVar57._0_4_;
      auVar117._4_4_ = fVar217 * auVar57._4_4_;
      auVar117._8_4_ = fVar226 * auVar57._8_4_;
      auVar117._12_4_ = fVar227 * auVar57._12_4_;
      auVar47 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar5,auVar47);
      auVar58 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar4,auVar120);
      local_2e0 = vsubps_avx512vl(local_360,auVar46);
      uVar107 = local_2e0._0_4_;
      auVar166._4_4_ = uVar107;
      auVar166._0_4_ = uVar107;
      auVar166._8_4_ = uVar107;
      auVar166._12_4_ = uVar107;
      auVar47 = vshufps_avx(local_2e0,local_2e0,0x55);
      auVar57 = vshufps_avx(local_2e0,local_2e0,0xaa);
      auVar121._0_4_ = fVar231 * auVar57._0_4_;
      auVar121._4_4_ = fVar217 * auVar57._4_4_;
      auVar121._8_4_ = fVar226 * auVar57._8_4_;
      auVar121._12_4_ = fVar227 * auVar57._12_4_;
      auVar47 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar5,auVar47);
      auVar59 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar4,auVar166);
      local_2f0 = vsubps_avx(local_370,auVar46);
      uVar107 = local_2f0._0_4_;
      auVar189._4_4_ = uVar107;
      auVar189._0_4_ = uVar107;
      auVar189._8_4_ = uVar107;
      auVar189._12_4_ = uVar107;
      auVar47 = vshufps_avx(local_2f0,local_2f0,0x55);
      auVar57 = vshufps_avx(local_2f0,local_2f0,0xaa);
      auVar167._0_4_ = fVar231 * auVar57._0_4_;
      auVar167._4_4_ = fVar217 * auVar57._4_4_;
      auVar167._8_4_ = fVar226 * auVar57._8_4_;
      auVar167._12_4_ = fVar227 * auVar57._12_4_;
      auVar47 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar5,auVar47);
      auVar64 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar4,auVar189);
      local_300 = vsubps_avx512vl(_local_380,auVar46);
      uVar107 = local_300._0_4_;
      auVar190._4_4_ = uVar107;
      auVar190._0_4_ = uVar107;
      auVar190._8_4_ = uVar107;
      auVar190._12_4_ = uVar107;
      auVar47 = vshufps_avx(local_300,local_300,0x55);
      auVar57 = vshufps_avx(local_300,local_300,0xaa);
      auVar213._0_4_ = auVar57._0_4_ * fVar231;
      auVar213._4_4_ = auVar57._4_4_ * fVar217;
      auVar213._8_4_ = auVar57._8_4_ * fVar226;
      auVar213._12_4_ = auVar57._12_4_ * fVar227;
      auVar47 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar5,auVar47);
      auVar65 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar4,auVar190);
      local_310 = vsubps_avx512vl(_local_390,auVar46);
      uVar107 = local_310._0_4_;
      auVar191._4_4_ = uVar107;
      auVar191._0_4_ = uVar107;
      auVar191._8_4_ = uVar107;
      auVar191._12_4_ = uVar107;
      auVar47 = vshufps_avx(local_310,local_310,0x55);
      auVar57 = vshufps_avx(local_310,local_310,0xaa);
      auVar218._0_4_ = auVar57._0_4_ * fVar231;
      auVar218._4_4_ = auVar57._4_4_ * fVar217;
      auVar218._8_4_ = auVar57._8_4_ * fVar226;
      auVar218._12_4_ = auVar57._12_4_ * fVar227;
      auVar47 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar5,auVar47);
      auVar66 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar4,auVar191);
      local_320 = vsubps_avx512vl(_local_3a0,auVar46);
      uVar107 = local_320._0_4_;
      auVar192._4_4_ = uVar107;
      auVar192._0_4_ = uVar107;
      auVar192._8_4_ = uVar107;
      auVar192._12_4_ = uVar107;
      auVar47 = vshufps_avx(local_320,local_320,0x55);
      auVar57 = vshufps_avx(local_320,local_320,0xaa);
      auVar233._0_4_ = auVar57._0_4_ * fVar231;
      auVar233._4_4_ = auVar57._4_4_ * fVar217;
      auVar233._8_4_ = auVar57._8_4_ * fVar226;
      auVar233._12_4_ = auVar57._12_4_ * fVar227;
      auVar47 = vfmadd231ps_fma(auVar233,(undefined1  [16])aVar5,auVar47);
      auVar20 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar4,auVar192);
      local_330 = vsubps_avx(_local_3b0,auVar46);
      uVar107 = local_330._0_4_;
      auVar136._4_4_ = uVar107;
      auVar136._0_4_ = uVar107;
      auVar136._8_4_ = uVar107;
      auVar136._12_4_ = uVar107;
      auVar46 = vshufps_avx(local_330,local_330,0x55);
      auVar47 = vshufps_avx(local_330,local_330,0xaa);
      auVar179._0_4_ = auVar47._0_4_ * fVar231;
      auVar179._4_4_ = auVar47._4_4_ * fVar217;
      auVar179._8_4_ = auVar47._8_4_ * fVar226;
      auVar179._12_4_ = auVar47._12_4_ * fVar227;
      auVar46 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar46);
      auVar21 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar4,auVar136);
      auVar57 = vmovlhps_avx(auVar61,auVar65);
      auVar56 = vmovlhps_avx(auVar58,auVar66);
      local_440 = vmovlhps_avx(auVar59,auVar20);
      _local_280 = vmovlhps_avx512f(auVar64,auVar21);
      auVar47 = vminps_avx(auVar57,auVar56);
      auVar46 = vmaxps_avx(auVar57,auVar56);
      auVar60 = vminps_avx512vl(local_440,_local_280);
      auVar47 = vminps_avx(auVar47,auVar60);
      auVar60 = vmaxps_avx512vl(local_440,_local_280);
      auVar46 = vmaxps_avx(auVar46,auVar60);
      auVar60 = vshufpd_avx(auVar47,auVar47,3);
      auVar47 = vminps_avx(auVar47,auVar60);
      auVar60 = vshufpd_avx(auVar46,auVar46,3);
      auVar46 = vmaxps_avx(auVar46,auVar60);
      auVar47 = vandps_avx512vl(auVar47,auVar265._0_16_);
      auVar46 = vandps_avx512vl(auVar46,auVar265._0_16_);
      auVar46 = vmaxps_avx(auVar47,auVar46);
      auVar47 = vmovshdup_avx(auVar46);
      auVar46 = vmaxss_avx(auVar47,auVar46);
      local_450 = vmovddup_avx512vl(auVar61);
      auVar266 = ZEXT1664(local_450);
      auVar47 = vmovddup_avx512vl(auVar58);
      auVar60 = vmovddup_avx512vl(auVar59);
      auVar61 = vmovddup_avx512vl(auVar64);
      local_270 = ZEXT416((uint)(auVar46._0_4_ * 9.536743e-07));
      local_260 = vbroadcastss_avx512vl(local_270);
      auVar46 = vxorps_avx512vl(local_260._0_16_,auVar67);
      local_1c0 = auVar46._0_4_;
      uStack_1bc = local_1c0;
      uStack_1b8 = local_1c0;
      uStack_1b4 = local_1c0;
      uStack_1b0 = local_1c0;
      uStack_1ac = local_1c0;
      uStack_1a8 = local_1c0;
      uStack_1a4 = local_1c0;
      uVar34 = 0;
      local_290 = vsubps_avx(auVar56,auVar57);
      local_2a0 = vsubps_avx(local_440,auVar56);
      local_2b0 = vsubps_avx512vl(_local_280,local_440);
      local_3c0 = vsubps_avx512vl(_local_380,local_340);
      local_3d0 = vsubps_avx512vl(_local_390,local_350);
      local_3e0 = vsubps_avx512vl(_local_3a0,local_360);
      _local_3f0 = vsubps_avx(_local_3b0,local_370);
      local_1e0 = vpbroadcastd_avx512vl();
      local_200 = vpbroadcastd_avx512vl();
      auVar46 = ZEXT816(0x3f80000000000000);
      auVar118 = auVar46;
LAB_01b908f9:
      auVar58 = vshufps_avx(auVar118,auVar118,0x50);
      auVar250._8_4_ = 0x3f800000;
      auVar250._0_8_ = 0x3f8000003f800000;
      auVar250._12_4_ = 0x3f800000;
      auVar93._16_4_ = 0x3f800000;
      auVar93._0_16_ = auVar250;
      auVar93._20_4_ = 0x3f800000;
      auVar93._24_4_ = 0x3f800000;
      auVar93._28_4_ = 0x3f800000;
      auVar59 = vsubps_avx(auVar250,auVar58);
      fVar231 = auVar58._0_4_;
      fVar133 = auVar65._0_4_;
      auVar137._0_4_ = fVar133 * fVar231;
      fVar217 = auVar58._4_4_;
      fVar142 = auVar65._4_4_;
      auVar137._4_4_ = fVar142 * fVar217;
      fVar226 = auVar58._8_4_;
      auVar137._8_4_ = fVar133 * fVar226;
      fVar227 = auVar58._12_4_;
      auVar137._12_4_ = fVar142 * fVar227;
      fVar143 = auVar66._0_4_;
      auVar151._0_4_ = fVar143 * fVar231;
      fVar158 = auVar66._4_4_;
      auVar151._4_4_ = fVar158 * fVar217;
      auVar151._8_4_ = fVar143 * fVar226;
      auVar151._12_4_ = fVar158 * fVar227;
      fVar159 = auVar20._0_4_;
      auVar168._0_4_ = fVar159 * fVar231;
      fVar174 = auVar20._4_4_;
      auVar168._4_4_ = fVar174 * fVar217;
      auVar168._8_4_ = fVar159 * fVar226;
      auVar168._12_4_ = fVar174 * fVar227;
      fVar175 = auVar21._0_4_;
      auVar122._0_4_ = fVar175 * fVar231;
      fVar184 = auVar21._4_4_;
      auVar122._4_4_ = fVar184 * fVar217;
      auVar122._8_4_ = fVar175 * fVar226;
      auVar122._12_4_ = fVar184 * fVar227;
      auVar64 = vfmadd231ps_avx512vl(auVar137,auVar59,auVar266._0_16_);
      auVar67 = vfmadd231ps_avx512vl(auVar151,auVar59,auVar47);
      auVar68 = vfmadd231ps_avx512vl(auVar168,auVar59,auVar60);
      auVar59 = vfmadd231ps_avx512vl(auVar122,auVar61,auVar59);
      auVar58 = vmovshdup_avx(auVar46);
      fVar217 = auVar46._0_4_;
      fVar231 = (auVar58._0_4_ - fVar217) * 0.04761905;
      auVar87._4_4_ = fVar217;
      auVar87._0_4_ = fVar217;
      auVar87._8_4_ = fVar217;
      auVar87._12_4_ = fVar217;
      auVar87._16_4_ = fVar217;
      auVar87._20_4_ = fVar217;
      auVar87._24_4_ = fVar217;
      auVar87._28_4_ = fVar217;
      auVar77._0_8_ = auVar58._0_8_;
      auVar77._8_8_ = auVar77._0_8_;
      auVar77._16_8_ = auVar77._0_8_;
      auVar77._24_8_ = auVar77._0_8_;
      auVar90 = vsubps_avx(auVar77,auVar87);
      uVar107 = auVar64._0_4_;
      auVar91._4_4_ = uVar107;
      auVar91._0_4_ = uVar107;
      auVar91._8_4_ = uVar107;
      auVar91._12_4_ = uVar107;
      auVar91._16_4_ = uVar107;
      auVar91._20_4_ = uVar107;
      auVar91._24_4_ = uVar107;
      auVar91._28_4_ = uVar107;
      auVar79._8_4_ = 1;
      auVar79._0_8_ = 0x100000001;
      auVar79._12_4_ = 1;
      auVar79._16_4_ = 1;
      auVar79._20_4_ = 1;
      auVar79._24_4_ = 1;
      auVar79._28_4_ = 1;
      auVar89 = ZEXT1632(auVar64);
      auVar88 = vpermps_avx2(auVar79,auVar89);
      auVar73 = vbroadcastss_avx512vl(auVar67);
      auVar83 = ZEXT1632(auVar67);
      auVar74 = vpermps_avx512vl(auVar79,auVar83);
      auVar75 = vbroadcastss_avx512vl(auVar68);
      auVar84 = ZEXT1632(auVar68);
      auVar76 = vpermps_avx512vl(auVar79,auVar84);
      auVar77 = vbroadcastss_avx512vl(auVar59);
      auVar86 = ZEXT1632(auVar59);
      auVar78 = vpermps_avx512vl(auVar79,auVar86);
      auVar92._4_4_ = fVar231;
      auVar92._0_4_ = fVar231;
      auVar92._8_4_ = fVar231;
      auVar92._12_4_ = fVar231;
      auVar92._16_4_ = fVar231;
      auVar92._20_4_ = fVar231;
      auVar92._24_4_ = fVar231;
      auVar92._28_4_ = fVar231;
      auVar85._8_4_ = 2;
      auVar85._0_8_ = 0x200000002;
      auVar85._12_4_ = 2;
      auVar85._16_4_ = 2;
      auVar85._20_4_ = 2;
      auVar85._24_4_ = 2;
      auVar85._28_4_ = 2;
      auVar79 = vpermps_avx512vl(auVar85,auVar89);
      auVar80 = vbroadcastss_avx512vl(ZEXT416(3));
      auVar81 = vpermps_avx512vl(auVar80,auVar89);
      auVar82 = vpermps_avx512vl(auVar85,auVar83);
      auVar83 = vpermps_avx512vl(auVar80,auVar83);
      auVar89 = vpermps_avx2(auVar85,auVar84);
      auVar84 = vpermps_avx512vl(auVar80,auVar84);
      auVar85 = vpermps_avx512vl(auVar85,auVar86);
      auVar80 = vpermps_avx512vl(auVar80,auVar86);
      auVar58 = vfmadd132ps_fma(auVar90,auVar87,_DAT_01faff20);
      auVar90 = vsubps_avx(auVar93,ZEXT1632(auVar58));
      auVar86 = vmulps_avx512vl(auVar73,ZEXT1632(auVar58));
      auVar93 = ZEXT1632(auVar58);
      auVar87 = vmulps_avx512vl(auVar74,auVar93);
      auVar59 = vfmadd231ps_fma(auVar86,auVar90,auVar91);
      auVar64 = vfmadd231ps_fma(auVar87,auVar90,auVar88);
      auVar86 = vmulps_avx512vl(auVar75,auVar93);
      auVar87 = vmulps_avx512vl(auVar76,auVar93);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar90,auVar73);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar90,auVar74);
      auVar73 = vmulps_avx512vl(auVar77,auVar93);
      auVar91 = ZEXT1632(auVar58);
      auVar74 = vmulps_avx512vl(auVar78,auVar91);
      auVar75 = vfmadd231ps_avx512vl(auVar73,auVar90,auVar75);
      auVar76 = vfmadd231ps_avx512vl(auVar74,auVar90,auVar76);
      fVar226 = auVar58._0_4_;
      fVar227 = auVar58._4_4_;
      auVar73._4_4_ = fVar227 * auVar86._4_4_;
      auVar73._0_4_ = fVar226 * auVar86._0_4_;
      fVar228 = auVar58._8_4_;
      auVar73._8_4_ = fVar228 * auVar86._8_4_;
      fVar229 = auVar58._12_4_;
      auVar73._12_4_ = fVar229 * auVar86._12_4_;
      auVar73._16_4_ = auVar86._16_4_ * 0.0;
      auVar73._20_4_ = auVar86._20_4_ * 0.0;
      auVar73._24_4_ = auVar86._24_4_ * 0.0;
      auVar73._28_4_ = fVar217;
      auVar74._4_4_ = fVar227 * auVar87._4_4_;
      auVar74._0_4_ = fVar226 * auVar87._0_4_;
      auVar74._8_4_ = fVar228 * auVar87._8_4_;
      auVar74._12_4_ = fVar229 * auVar87._12_4_;
      auVar74._16_4_ = auVar87._16_4_ * 0.0;
      auVar74._20_4_ = auVar87._20_4_ * 0.0;
      auVar74._24_4_ = auVar87._24_4_ * 0.0;
      auVar74._28_4_ = auVar88._28_4_;
      auVar59 = vfmadd231ps_fma(auVar73,auVar90,ZEXT1632(auVar59));
      auVar64 = vfmadd231ps_fma(auVar74,auVar90,ZEXT1632(auVar64));
      auVar78._0_4_ = fVar226 * auVar75._0_4_;
      auVar78._4_4_ = fVar227 * auVar75._4_4_;
      auVar78._8_4_ = fVar228 * auVar75._8_4_;
      auVar78._12_4_ = fVar229 * auVar75._12_4_;
      auVar78._16_4_ = auVar75._16_4_ * 0.0;
      auVar78._20_4_ = auVar75._20_4_ * 0.0;
      auVar78._24_4_ = auVar75._24_4_ * 0.0;
      auVar78._28_4_ = 0;
      auVar88._4_4_ = fVar227 * auVar76._4_4_;
      auVar88._0_4_ = fVar226 * auVar76._0_4_;
      auVar88._8_4_ = fVar228 * auVar76._8_4_;
      auVar88._12_4_ = fVar229 * auVar76._12_4_;
      auVar88._16_4_ = auVar76._16_4_ * 0.0;
      auVar88._20_4_ = auVar76._20_4_ * 0.0;
      auVar88._24_4_ = auVar76._24_4_ * 0.0;
      auVar88._28_4_ = auVar75._28_4_;
      auVar67 = vfmadd231ps_fma(auVar78,auVar90,auVar86);
      auVar68 = vfmadd231ps_fma(auVar88,auVar90,auVar87);
      auVar75._28_4_ = auVar87._28_4_;
      auVar75._0_28_ =
           ZEXT1628(CONCAT412(fVar229 * auVar68._12_4_,
                              CONCAT48(fVar228 * auVar68._8_4_,
                                       CONCAT44(fVar227 * auVar68._4_4_,fVar226 * auVar68._0_4_))));
      auVar48 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar229 * auVar67._12_4_,
                                                   CONCAT48(fVar228 * auVar67._8_4_,
                                                            CONCAT44(fVar227 * auVar67._4_4_,
                                                                     fVar226 * auVar67._0_4_)))),
                                auVar90,ZEXT1632(auVar59));
      auVar50 = vfmadd231ps_fma(auVar75,auVar90,ZEXT1632(auVar64));
      auVar88 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar59));
      auVar73 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar64));
      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar88 = vmulps_avx512vl(auVar88,auVar74);
      auVar73 = vmulps_avx512vl(auVar73,auVar74);
      auVar86._0_4_ = fVar231 * auVar88._0_4_;
      auVar86._4_4_ = fVar231 * auVar88._4_4_;
      auVar86._8_4_ = fVar231 * auVar88._8_4_;
      auVar86._12_4_ = fVar231 * auVar88._12_4_;
      auVar86._16_4_ = fVar231 * auVar88._16_4_;
      auVar86._20_4_ = fVar231 * auVar88._20_4_;
      auVar86._24_4_ = fVar231 * auVar88._24_4_;
      auVar86._28_4_ = 0;
      auVar88 = vmulps_avx512vl(auVar92,auVar73);
      auVar64 = vxorps_avx512vl(auVar77._0_16_,auVar77._0_16_);
      auVar73 = vpermt2ps_avx512vl(ZEXT1632(auVar48),_DAT_01feed00,ZEXT1632(auVar64));
      auVar75 = vpermt2ps_avx512vl(ZEXT1632(auVar50),_DAT_01feed00,ZEXT1632(auVar64));
      auVar125._0_4_ = auVar86._0_4_ + auVar48._0_4_;
      auVar125._4_4_ = auVar86._4_4_ + auVar48._4_4_;
      auVar125._8_4_ = auVar86._8_4_ + auVar48._8_4_;
      auVar125._12_4_ = auVar86._12_4_ + auVar48._12_4_;
      auVar125._16_4_ = auVar86._16_4_ + 0.0;
      auVar125._20_4_ = auVar86._20_4_ + 0.0;
      auVar125._24_4_ = auVar86._24_4_ + 0.0;
      auVar125._28_4_ = 0;
      auVar87 = ZEXT1632(auVar64);
      auVar76 = vpermt2ps_avx512vl(auVar86,_DAT_01feed00,auVar87);
      auVar77 = vaddps_avx512vl(ZEXT1632(auVar50),auVar88);
      auVar78 = vpermt2ps_avx512vl(auVar88,_DAT_01feed00,auVar87);
      auVar88 = vsubps_avx(auVar73,auVar76);
      auVar78 = vsubps_avx512vl(auVar75,auVar78);
      auVar76 = vmulps_avx512vl(auVar82,auVar91);
      auVar86 = vmulps_avx512vl(auVar83,auVar91);
      auVar76 = vfmadd231ps_avx512vl(auVar76,auVar90,auVar79);
      auVar79 = vfmadd231ps_avx512vl(auVar86,auVar90,auVar81);
      auVar81 = vmulps_avx512vl(auVar89,auVar91);
      auVar86 = vmulps_avx512vl(auVar84,auVar91);
      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar90,auVar82);
      auVar82 = vfmadd231ps_avx512vl(auVar86,auVar90,auVar83);
      auVar83 = vmulps_avx512vl(auVar85,auVar91);
      auVar80 = vmulps_avx512vl(auVar80,auVar91);
      auVar59 = vfmadd231ps_fma(auVar83,auVar90,auVar89);
      auVar89 = vfmadd231ps_avx512vl(auVar80,auVar90,auVar84);
      auVar80 = vmulps_avx512vl(auVar91,auVar81);
      auVar85 = ZEXT1632(auVar58);
      auVar83 = vmulps_avx512vl(auVar85,auVar82);
      auVar76 = vfmadd231ps_avx512vl(auVar80,auVar90,auVar76);
      auVar79 = vfmadd231ps_avx512vl(auVar83,auVar90,auVar79);
      auVar89 = vmulps_avx512vl(auVar85,auVar89);
      auVar80 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar229 * auVar59._12_4_,
                                              CONCAT48(fVar228 * auVar59._8_4_,
                                                       CONCAT44(fVar227 * auVar59._4_4_,
                                                                fVar226 * auVar59._0_4_)))),auVar90,
                           auVar81);
      auVar81 = vfmadd231ps_avx512vl(auVar89,auVar90,auVar82);
      auVar89._4_4_ = fVar227 * auVar80._4_4_;
      auVar89._0_4_ = fVar226 * auVar80._0_4_;
      auVar89._8_4_ = fVar228 * auVar80._8_4_;
      auVar89._12_4_ = fVar229 * auVar80._12_4_;
      auVar89._16_4_ = auVar80._16_4_ * 0.0;
      auVar89._20_4_ = auVar80._20_4_ * 0.0;
      auVar89._24_4_ = auVar80._24_4_ * 0.0;
      auVar89._28_4_ = auVar84._28_4_;
      auVar82 = vmulps_avx512vl(auVar85,auVar81);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar90,auVar76);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar79,auVar90);
      auVar90 = vsubps_avx512vl(auVar80,auVar76);
      auVar76 = vsubps_avx512vl(auVar81,auVar79);
      auVar79 = vmulps_avx512vl(auVar90,auVar74);
      auVar74 = vmulps_avx512vl(auVar76,auVar74);
      fVar217 = fVar231 * auVar79._0_4_;
      fVar226 = fVar231 * auVar79._4_4_;
      auVar90._4_4_ = fVar226;
      auVar90._0_4_ = fVar217;
      fVar227 = fVar231 * auVar79._8_4_;
      auVar90._8_4_ = fVar227;
      fVar228 = fVar231 * auVar79._12_4_;
      auVar90._12_4_ = fVar228;
      fVar229 = fVar231 * auVar79._16_4_;
      auVar90._16_4_ = fVar229;
      fVar230 = fVar231 * auVar79._20_4_;
      auVar90._20_4_ = fVar230;
      fVar231 = fVar231 * auVar79._24_4_;
      auVar90._24_4_ = fVar231;
      auVar90._28_4_ = auVar79._28_4_;
      auVar74 = vmulps_avx512vl(auVar92,auVar74);
      auVar80 = vpermt2ps_avx512vl(auVar89,_DAT_01feed00,auVar87);
      auVar81 = vpermt2ps_avx512vl(auVar82,_DAT_01feed00,auVar87);
      auVar216._0_4_ = auVar89._0_4_ + fVar217;
      auVar216._4_4_ = auVar89._4_4_ + fVar226;
      auVar216._8_4_ = auVar89._8_4_ + fVar227;
      auVar216._12_4_ = auVar89._12_4_ + fVar228;
      auVar216._16_4_ = auVar89._16_4_ + fVar229;
      auVar216._20_4_ = auVar89._20_4_ + fVar230;
      auVar216._24_4_ = auVar89._24_4_ + fVar231;
      auVar216._28_4_ = auVar89._28_4_ + auVar79._28_4_;
      auVar90 = vpermt2ps_avx512vl(auVar90,_DAT_01feed00,ZEXT1632(auVar64));
      auVar79 = vaddps_avx512vl(auVar82,auVar74);
      auVar74 = vpermt2ps_avx512vl(auVar74,_DAT_01feed00,ZEXT1632(auVar64));
      auVar90 = vsubps_avx(auVar80,auVar90);
      auVar74 = vsubps_avx512vl(auVar81,auVar74);
      auVar94 = ZEXT1632(auVar48);
      auVar76 = vsubps_avx512vl(auVar89,auVar94);
      auVar96 = ZEXT1632(auVar50);
      auVar83 = vsubps_avx512vl(auVar82,auVar96);
      auVar84 = vsubps_avx512vl(auVar80,auVar73);
      auVar76 = vaddps_avx512vl(auVar76,auVar84);
      auVar84 = vsubps_avx512vl(auVar81,auVar75);
      auVar83 = vaddps_avx512vl(auVar83,auVar84);
      auVar84 = vmulps_avx512vl(auVar96,auVar76);
      auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar94,auVar83);
      auVar85 = vmulps_avx512vl(auVar77,auVar76);
      auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar125,auVar83);
      auVar86 = vmulps_avx512vl(auVar78,auVar76);
      auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar88,auVar83);
      auVar87 = vmulps_avx512vl(auVar75,auVar76);
      auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar73,auVar83);
      auVar91 = vmulps_avx512vl(auVar82,auVar76);
      auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar89,auVar83);
      auVar92 = vmulps_avx512vl(auVar79,auVar76);
      auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar216,auVar83);
      auVar93 = vmulps_avx512vl(auVar74,auVar76);
      auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar90,auVar83);
      auVar76 = vmulps_avx512vl(auVar81,auVar76);
      auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar80,auVar83);
      auVar83 = vminps_avx512vl(auVar84,auVar85);
      auVar84 = vmaxps_avx512vl(auVar84,auVar85);
      auVar85 = vminps_avx512vl(auVar86,auVar87);
      auVar83 = vminps_avx512vl(auVar83,auVar85);
      auVar85 = vmaxps_avx512vl(auVar86,auVar87);
      auVar84 = vmaxps_avx512vl(auVar84,auVar85);
      auVar85 = vminps_avx512vl(auVar91,auVar92);
      auVar86 = vmaxps_avx512vl(auVar91,auVar92);
      auVar87 = vminps_avx512vl(auVar93,auVar76);
      auVar85 = vminps_avx512vl(auVar85,auVar87);
      auVar83 = vminps_avx512vl(auVar83,auVar85);
      auVar76 = vmaxps_avx512vl(auVar93,auVar76);
      auVar76 = vmaxps_avx512vl(auVar86,auVar76);
      auVar84 = vmaxps_avx512vl(auVar84,auVar76);
      uVar18 = vcmpps_avx512vl(auVar83,local_260,2);
      auVar76._4_4_ = uStack_1bc;
      auVar76._0_4_ = local_1c0;
      auVar76._8_4_ = uStack_1b8;
      auVar76._12_4_ = uStack_1b4;
      auVar76._16_4_ = uStack_1b0;
      auVar76._20_4_ = uStack_1ac;
      auVar76._24_4_ = uStack_1a8;
      auVar76._28_4_ = uStack_1a4;
      uVar19 = vcmpps_avx512vl(auVar84,auVar76,5);
      bVar32 = (byte)uVar18 & (byte)uVar19 & 0x7f;
      if (bVar32 == 0) {
        auVar58 = vxorps_avx512vl(auVar84._0_16_,auVar84._0_16_);
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar59 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      }
      else {
        auVar83 = vsubps_avx512vl(auVar73,auVar94);
        auVar84 = vsubps_avx512vl(auVar75,auVar96);
        auVar85 = vsubps_avx512vl(auVar80,auVar89);
        auVar83 = vaddps_avx512vl(auVar83,auVar85);
        auVar85 = vsubps_avx512vl(auVar81,auVar82);
        auVar84 = vaddps_avx512vl(auVar84,auVar85);
        auVar85 = vmulps_avx512vl(auVar96,auVar83);
        auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar84,auVar94);
        auVar77 = vmulps_avx512vl(auVar77,auVar83);
        auVar77 = vfnmadd213ps_avx512vl(auVar125,auVar84,auVar77);
        auVar78 = vmulps_avx512vl(auVar78,auVar83);
        auVar78 = vfnmadd213ps_avx512vl(auVar88,auVar84,auVar78);
        auVar88 = vmulps_avx512vl(auVar75,auVar83);
        auVar75 = vfnmadd231ps_avx512vl(auVar88,auVar84,auVar73);
        auVar88 = vmulps_avx512vl(auVar82,auVar83);
        auVar82 = vfnmadd231ps_avx512vl(auVar88,auVar84,auVar89);
        auVar88 = vmulps_avx512vl(auVar79,auVar83);
        auVar79 = vfnmadd213ps_avx512vl(auVar216,auVar84,auVar88);
        auVar88 = vmulps_avx512vl(auVar74,auVar83);
        auVar86 = vfnmadd213ps_avx512vl(auVar90,auVar84,auVar88);
        auVar90 = vmulps_avx512vl(auVar81,auVar83);
        auVar80 = vfnmadd231ps_avx512vl(auVar90,auVar80,auVar84);
        auVar88 = vminps_avx(auVar85,auVar77);
        auVar90 = vmaxps_avx(auVar85,auVar77);
        auVar73 = vminps_avx(auVar78,auVar75);
        auVar73 = vminps_avx(auVar88,auVar73);
        auVar88 = vmaxps_avx(auVar78,auVar75);
        auVar90 = vmaxps_avx(auVar90,auVar88);
        auVar89 = vminps_avx(auVar82,auVar79);
        auVar88 = vmaxps_avx(auVar82,auVar79);
        auVar74 = vminps_avx(auVar86,auVar80);
        auVar89 = vminps_avx(auVar89,auVar74);
        auVar89 = vminps_avx(auVar73,auVar89);
        auVar73 = vmaxps_avx(auVar86,auVar80);
        auVar88 = vmaxps_avx(auVar88,auVar73);
        auVar90 = vmaxps_avx(auVar90,auVar88);
        uVar18 = vcmpps_avx512vl(auVar90,auVar76,5);
        uVar19 = vcmpps_avx512vl(auVar89,local_260,2);
        bVar32 = bVar32 & (byte)uVar18 & (byte)uVar19;
        if (bVar32 != 0) {
          auStack_430[uVar34] = (uint)bVar32;
          uVar18 = vmovlps_avx(auVar46);
          (&uStack_240)[uVar34] = uVar18;
          uVar3 = vmovlps_avx(auVar118);
          auStack_1a0[uVar34] = uVar3;
          uVar34 = (ulong)((int)uVar34 + 1);
        }
        auVar58 = vxorps_avx512vl(auVar83._0_16_,auVar83._0_16_);
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar59 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      }
      auVar264 = ZEXT1664(auVar46);
      auVar263 = ZEXT3264(_DAT_01feed20);
      auVar262 = ZEXT1664(auVar59);
      in_ZMM19 = ZEXT3264(auVar90);
      auVar261 = ZEXT1664(auVar58);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar268 = ZEXT1664(auVar46);
      if ((int)uVar34 != 0) {
        do {
          auVar58 = auVar261._0_16_;
          auVar59 = auVar264._0_16_;
          uVar33 = (int)uVar34 - 1;
          uVar35 = (ulong)uVar33;
          uVar8 = auStack_430[uVar35];
          auVar118._8_8_ = 0;
          auVar118._0_8_ = auStack_1a0[uVar35];
          uVar3 = 0;
          for (uVar39 = (ulong)uVar8; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000)
          {
            uVar3 = uVar3 + 1;
          }
          uVar37 = uVar8 - 1 & uVar8;
          bVar43 = uVar37 == 0;
          auStack_430[uVar35] = uVar37;
          if (bVar43) {
            uVar34 = (ulong)uVar33;
          }
          auVar111._8_8_ = 0;
          auVar111._0_8_ = uVar3;
          auVar46 = vpunpcklqdq_avx(auVar111,ZEXT416((int)uVar3 + 1));
          auVar46 = vcvtqq2ps_avx512vl(auVar46);
          auVar46 = vmulps_avx512vl(auVar46,auVar262._0_16_);
          uVar107 = *(undefined4 *)((long)&uStack_240 + uVar35 * 8 + 4);
          auVar22._4_4_ = uVar107;
          auVar22._0_4_ = uVar107;
          auVar22._8_4_ = uVar107;
          auVar22._12_4_ = uVar107;
          auVar64 = vmulps_avx512vl(auVar46,auVar22);
          auVar127._8_4_ = 0x3f800000;
          auVar127._0_8_ = 0x3f8000003f800000;
          auVar127._12_4_ = 0x3f800000;
          auVar46 = vsubps_avx(auVar127,auVar46);
          uVar107 = *(undefined4 *)(&uStack_240 + uVar35);
          auVar23._4_4_ = uVar107;
          auVar23._0_4_ = uVar107;
          auVar23._8_4_ = uVar107;
          auVar23._12_4_ = uVar107;
          auVar46 = vfmadd231ps_avx512vl(auVar64,auVar46,auVar23);
          auVar64 = vmovshdup_avx(auVar46);
          fVar231 = auVar64._0_4_ - auVar46._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar231));
          if (uVar8 == 0 || bVar43) goto LAB_01b908f9;
          auVar64 = vshufps_avx(auVar118,auVar118,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar231));
          uVar33 = (uint)uVar34;
          auVar138._8_4_ = 0x3f800000;
          auVar138._0_8_ = 0x3f8000003f800000;
          auVar138._12_4_ = 0x3f800000;
          auVar67 = vsubps_avx(auVar138,auVar64);
          fVar217 = auVar64._0_4_;
          auVar152._0_4_ = fVar217 * fVar133;
          fVar226 = auVar64._4_4_;
          auVar152._4_4_ = fVar226 * fVar142;
          fVar227 = auVar64._8_4_;
          auVar152._8_4_ = fVar227 * fVar133;
          fVar228 = auVar64._12_4_;
          auVar152._12_4_ = fVar228 * fVar142;
          auVar169._0_4_ = fVar217 * fVar143;
          auVar169._4_4_ = fVar226 * fVar158;
          auVar169._8_4_ = fVar227 * fVar143;
          auVar169._12_4_ = fVar228 * fVar158;
          auVar180._0_4_ = fVar217 * fVar159;
          auVar180._4_4_ = fVar226 * fVar174;
          auVar180._8_4_ = fVar227 * fVar159;
          auVar180._12_4_ = fVar228 * fVar174;
          auVar128._0_4_ = fVar217 * fVar175;
          auVar128._4_4_ = fVar226 * fVar184;
          auVar128._8_4_ = fVar227 * fVar175;
          auVar128._12_4_ = fVar228 * fVar184;
          auVar48 = vfmadd231ps_avx512vl(auVar152,auVar67,auVar266._0_16_);
          auVar64 = vfmadd231ps_fma(auVar169,auVar67,auVar47);
          auVar68 = vfmadd231ps_fma(auVar180,auVar67,auVar60);
          auVar67 = vfmadd231ps_fma(auVar128,auVar67,auVar61);
          auVar81._16_16_ = auVar48;
          auVar81._0_16_ = auVar48;
          auVar82._16_16_ = auVar64;
          auVar82._0_16_ = auVar64;
          auVar84._16_16_ = auVar68;
          auVar84._0_16_ = auVar68;
          auVar88 = vpermps_avx512vl(auVar263._0_32_,ZEXT1632(auVar46));
          auVar90 = vsubps_avx(auVar82,auVar81);
          auVar48 = vfmadd213ps_fma(auVar90,auVar88,auVar81);
          auVar90 = vsubps_avx(auVar84,auVar82);
          auVar50 = vfmadd213ps_fma(auVar90,auVar88,auVar82);
          auVar64 = vsubps_avx(auVar67,auVar68);
          auVar83._16_16_ = auVar64;
          auVar83._0_16_ = auVar64;
          auVar64 = vfmadd213ps_fma(auVar83,auVar88,auVar84);
          auVar90 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar48));
          auVar67 = vfmadd213ps_fma(auVar90,auVar88,ZEXT1632(auVar48));
          auVar90 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar50));
          auVar64 = vfmadd213ps_fma(auVar90,auVar88,ZEXT1632(auVar50));
          auVar90 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar67));
          auVar62 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar90,auVar88);
          auVar90 = vmulps_avx512vl(auVar90,in_ZMM19._0_32_);
          auVar80._16_16_ = auVar90._16_16_;
          auVar64 = vmulss_avx512f(ZEXT416((uint)fVar231),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar217 = auVar64._0_4_;
          auVar181._0_8_ =
               CONCAT44(auVar62._4_4_ + fVar217 * auVar90._4_4_,
                        auVar62._0_4_ + fVar217 * auVar90._0_4_);
          auVar181._8_4_ = auVar62._8_4_ + fVar217 * auVar90._8_4_;
          auVar181._12_4_ = auVar62._12_4_ + fVar217 * auVar90._12_4_;
          auVar153._0_4_ = fVar217 * auVar90._16_4_;
          auVar153._4_4_ = fVar217 * auVar90._20_4_;
          auVar153._8_4_ = fVar217 * auVar90._24_4_;
          auVar153._12_4_ = fVar217 * auVar90._28_4_;
          auVar53 = vsubps_avx((undefined1  [16])0x0,auVar153);
          auVar50 = vshufpd_avx(auVar62,auVar62,3);
          auVar49 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar64 = vsubps_avx(auVar50,auVar62);
          auVar67 = vsubps_avx(auVar49,(undefined1  [16])0x0);
          auVar203._0_4_ = auVar64._0_4_ + auVar67._0_4_;
          auVar203._4_4_ = auVar64._4_4_ + auVar67._4_4_;
          auVar203._8_4_ = auVar64._8_4_ + auVar67._8_4_;
          auVar203._12_4_ = auVar64._12_4_ + auVar67._12_4_;
          auVar64 = vshufps_avx(auVar62,auVar62,0xb1);
          auVar67 = vshufps_avx(auVar181,auVar181,0xb1);
          auVar68 = vshufps_avx(auVar53,auVar53,0xb1);
          auVar48 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar251._4_4_ = auVar203._0_4_;
          auVar251._0_4_ = auVar203._0_4_;
          auVar251._8_4_ = auVar203._0_4_;
          auVar251._12_4_ = auVar203._0_4_;
          auVar51 = vshufps_avx(auVar203,auVar203,0x55);
          fVar217 = auVar51._0_4_;
          auVar214._0_4_ = auVar64._0_4_ * fVar217;
          fVar226 = auVar51._4_4_;
          auVar214._4_4_ = auVar64._4_4_ * fVar226;
          fVar227 = auVar51._8_4_;
          auVar214._8_4_ = auVar64._8_4_ * fVar227;
          fVar228 = auVar51._12_4_;
          auVar214._12_4_ = auVar64._12_4_ * fVar228;
          auVar219._0_4_ = auVar67._0_4_ * fVar217;
          auVar219._4_4_ = auVar67._4_4_ * fVar226;
          auVar219._8_4_ = auVar67._8_4_ * fVar227;
          auVar219._12_4_ = auVar67._12_4_ * fVar228;
          auVar234._0_4_ = auVar68._0_4_ * fVar217;
          auVar234._4_4_ = auVar68._4_4_ * fVar226;
          auVar234._8_4_ = auVar68._8_4_ * fVar227;
          auVar234._12_4_ = auVar68._12_4_ * fVar228;
          auVar204._0_4_ = auVar48._0_4_ * fVar217;
          auVar204._4_4_ = auVar48._4_4_ * fVar226;
          auVar204._8_4_ = auVar48._8_4_ * fVar227;
          auVar204._12_4_ = auVar48._12_4_ * fVar228;
          auVar64 = vfmadd231ps_fma(auVar214,auVar251,auVar62);
          auVar67 = vfmadd231ps_fma(auVar219,auVar251,auVar181);
          auVar54 = vfmadd231ps_fma(auVar234,auVar251,auVar53);
          auVar55 = vfmadd231ps_fma(auVar204,(undefined1  [16])0x0,auVar251);
          auVar51 = vshufpd_avx(auVar64,auVar64,1);
          auVar52 = vshufpd_avx(auVar67,auVar67,1);
          auVar63 = vshufpd_avx512vl(auVar54,auVar54,1);
          auVar69 = vshufpd_avx512vl(auVar55,auVar55,1);
          auVar68 = vminss_avx(auVar64,auVar67);
          auVar64 = vmaxss_avx(auVar67,auVar64);
          auVar48 = vminss_avx(auVar54,auVar55);
          auVar67 = vmaxss_avx(auVar55,auVar54);
          auVar68 = vminss_avx(auVar68,auVar48);
          auVar64 = vmaxss_avx(auVar67,auVar64);
          auVar48 = vminss_avx(auVar51,auVar52);
          auVar67 = vmaxss_avx(auVar52,auVar51);
          auVar51 = vminss_avx512f(auVar63,auVar69);
          auVar52 = vmaxss_avx512f(auVar69,auVar63);
          auVar67 = vmaxss_avx(auVar52,auVar67);
          auVar48 = vminss_avx512f(auVar48,auVar51);
          vucomiss_avx512f(auVar68);
          fVar226 = auVar67._0_4_;
          fVar217 = auVar64._0_4_;
          if (uVar33 < 5) {
LAB_01b91089:
            auVar51 = vucomiss_avx512f(auVar48);
            bVar44 = fVar226 <= -0.0001;
            bVar42 = -0.0001 < fVar217;
            bVar41 = bVar44;
            if (!bVar44) goto LAB_01b910cf;
            uVar18 = vcmpps_avx512vl(auVar68,auVar51,5);
            uVar19 = vcmpps_avx512vl(auVar48,auVar51,5);
            bVar32 = (byte)uVar18 & (byte)uVar19 & 1;
            bVar44 = bVar42 && bVar32 == 0;
            bVar41 = bVar42 && bVar32 == 0;
            if (bVar42 && bVar32 == 0) goto LAB_01b910cf;
          }
          else {
            bVar44 = fVar226 == -0.0001;
            bVar41 = NAN(fVar226);
            if (fVar226 <= -0.0001) goto LAB_01b91089;
LAB_01b910cf:
            vcmpss_avx512f(auVar68,auVar58,1);
            auVar54 = auVar267._0_16_;
            uVar18 = vcmpss_avx512f(auVar64,auVar58,1);
            bVar42 = (bool)((byte)uVar18 & 1);
            auVar80._0_16_ = auVar54;
            iVar105 = auVar267._0_4_;
            auVar94._4_28_ = auVar80._4_28_;
            auVar94._0_4_ = (float)((uint)bVar42 * -0x40800000 + (uint)!bVar42 * iVar105);
            vucomiss_avx512f(auVar94._0_16_);
            bVar41 = (bool)(!bVar44 | bVar41);
            bVar42 = bVar41 == false;
            auVar96._16_16_ = auVar80._16_16_;
            auVar96._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar95._4_28_ = auVar96._4_28_;
            auVar95._0_4_ = (uint)bVar41 * auVar261._0_4_ + (uint)!bVar41 * 0x7f800000;
            auVar52 = auVar95._0_16_;
            auVar98._16_16_ = auVar80._16_16_;
            auVar98._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar97._4_28_ = auVar98._4_28_;
            auVar97._0_4_ = (uint)bVar41 * auVar261._0_4_ + (uint)!bVar41 * -0x800000;
            auVar51 = auVar97._0_16_;
            uVar18 = vcmpss_avx512f(auVar48,auVar58,1);
            bVar44 = (bool)((byte)uVar18 & 1);
            auVar100._16_16_ = auVar80._16_16_;
            auVar100._0_16_ = auVar54;
            auVar99._4_28_ = auVar100._4_28_;
            auVar99._0_4_ = (float)((uint)bVar44 * -0x40800000 + (uint)!bVar44 * iVar105);
            vucomiss_avx512f(auVar99._0_16_);
            if ((bVar41) || (bVar42)) {
              auVar48 = vucomiss_avx512f(auVar68);
              if ((bVar41) || (bVar42)) {
                auVar55 = vxorps_avx512vl(auVar68,auVar268._0_16_);
                auVar68 = vsubss_avx512f(auVar48,auVar68);
                auVar68 = vdivss_avx512f(auVar55,auVar68);
                auVar48 = vsubss_avx512f(auVar54,auVar68);
                auVar48 = vfmadd213ss_avx512f(auVar48,auVar58,auVar68);
                auVar68 = auVar48;
              }
              else {
                auVar48 = vxorps_avx512vl(auVar48,auVar48);
                vucomiss_avx512f(auVar48);
                if ((bVar41) || (auVar68 = auVar54, bVar42)) {
                  auVar48 = ZEXT416(0x7f800000);
                  auVar68 = SUB6416(ZEXT464(0xff800000),0);
                }
              }
              auVar52 = vminss_avx512f(auVar52,auVar48);
              auVar51 = vmaxss_avx(auVar68,auVar51);
            }
            uVar18 = vcmpss_avx512f(auVar67,auVar58,1);
            bVar44 = (bool)((byte)uVar18 & 1);
            fVar227 = (float)((uint)bVar44 * -0x40800000 + (uint)!bVar44 * iVar105);
            if ((auVar94._0_4_ != fVar227) || (NAN(auVar94._0_4_) || NAN(fVar227))) {
              if ((fVar226 != fVar217) || (NAN(fVar226) || NAN(fVar217))) {
                auVar64 = vxorps_avx512vl(auVar64,auVar268._0_16_);
                auVar205._0_4_ = auVar64._0_4_ / (fVar226 - fVar217);
                auVar205._4_12_ = auVar64._4_12_;
                auVar64 = vsubss_avx512f(auVar54,auVar205);
                auVar64 = vfmadd213ss_avx512f(auVar64,auVar58,auVar205);
                auVar67 = auVar64;
              }
              else if ((fVar217 != 0.0) ||
                      (auVar64 = auVar54, auVar67 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar217))) {
                auVar64 = SUB6416(ZEXT464(0xff800000),0);
                auVar67 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar52 = vminss_avx(auVar52,auVar67);
              auVar51 = vmaxss_avx(auVar64,auVar51);
            }
            bVar44 = auVar99._0_4_ != fVar227;
            auVar64 = vminss_avx512f(auVar52,auVar54);
            auVar102._16_16_ = auVar80._16_16_;
            auVar102._0_16_ = auVar52;
            auVar101._4_28_ = auVar102._4_28_;
            auVar101._0_4_ = (uint)bVar44 * auVar64._0_4_ + (uint)!bVar44 * auVar52._0_4_;
            auVar64 = vmaxss_avx512f(auVar54,auVar51);
            auVar104._16_16_ = auVar80._16_16_;
            auVar104._0_16_ = auVar51;
            auVar103._4_28_ = auVar104._4_28_;
            auVar103._0_4_ = (uint)bVar44 * auVar64._0_4_ + (uint)!bVar44 * auVar51._0_4_;
            auVar64 = vmaxss_avx512f(auVar58,auVar101._0_16_);
            auVar67 = vminss_avx512f(auVar103._0_16_,auVar54);
            if (auVar64._0_4_ <= auVar67._0_4_) {
              auVar55 = vmaxss_avx512f(auVar58,ZEXT416((uint)(auVar64._0_4_ + -0.1)));
              auVar69 = vminss_avx512f(ZEXT416((uint)(auVar67._0_4_ + 0.1)),auVar54);
              auVar129._0_8_ = auVar62._0_8_;
              auVar129._8_8_ = auVar129._0_8_;
              auVar220._8_8_ = auVar181._0_8_;
              auVar220._0_8_ = auVar181._0_8_;
              auVar235._8_8_ = auVar53._0_8_;
              auVar235._0_8_ = auVar53._0_8_;
              auVar64 = vshufpd_avx(auVar181,auVar181,3);
              auVar67 = vshufpd_avx(auVar53,auVar53,3);
              auVar68 = vshufps_avx(auVar55,auVar69,0);
              auVar252._8_4_ = 0x3f800000;
              auVar252._0_8_ = 0x3f8000003f800000;
              auVar252._12_4_ = 0x3f800000;
              auVar48 = vsubps_avx(auVar252,auVar68);
              fVar217 = auVar68._0_4_;
              auVar170._0_4_ = fVar217 * auVar50._0_4_;
              fVar226 = auVar68._4_4_;
              auVar170._4_4_ = fVar226 * auVar50._4_4_;
              fVar227 = auVar68._8_4_;
              auVar170._8_4_ = fVar227 * auVar50._8_4_;
              fVar228 = auVar68._12_4_;
              auVar170._12_4_ = fVar228 * auVar50._12_4_;
              auVar182._0_4_ = fVar217 * auVar64._0_4_;
              auVar182._4_4_ = fVar226 * auVar64._4_4_;
              auVar182._8_4_ = fVar227 * auVar64._8_4_;
              auVar182._12_4_ = fVar228 * auVar64._12_4_;
              auVar256._0_4_ = auVar67._0_4_ * fVar217;
              auVar256._4_4_ = auVar67._4_4_ * fVar226;
              auVar256._8_4_ = auVar67._8_4_ * fVar227;
              auVar256._12_4_ = auVar67._12_4_ * fVar228;
              auVar154._0_4_ = fVar217 * auVar49._0_4_;
              auVar154._4_4_ = fVar226 * auVar49._4_4_;
              auVar154._8_4_ = fVar227 * auVar49._8_4_;
              auVar154._12_4_ = fVar228 * auVar49._12_4_;
              auVar50 = vfmadd231ps_fma(auVar170,auVar48,auVar129);
              auVar49 = vfmadd231ps_fma(auVar182,auVar48,auVar220);
              auVar51 = vfmadd231ps_fma(auVar256,auVar48,auVar235);
              auVar52 = vfmadd231ps_fma(auVar154,auVar48,ZEXT816(0));
              auVar67 = vsubss_avx512f(auVar54,auVar55);
              auVar64 = vmovshdup_avx(auVar118);
              auVar63 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar55._0_4_)),auVar118,
                                        auVar67);
              auVar67 = vsubss_avx512f(auVar54,auVar69);
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar69._0_4_)),auVar118,
                                        auVar67);
              auVar53 = vdivss_avx512f(auVar54,ZEXT416((uint)fVar231));
              auVar64 = vsubps_avx(auVar49,auVar50);
              auVar68 = vmulps_avx512vl(auVar64,auVar59);
              auVar64 = vsubps_avx(auVar51,auVar49);
              auVar48 = vmulps_avx512vl(auVar64,auVar59);
              auVar64 = vsubps_avx(auVar52,auVar51);
              auVar64 = vmulps_avx512vl(auVar64,auVar59);
              auVar67 = vminps_avx(auVar48,auVar64);
              auVar64 = vmaxps_avx(auVar48,auVar64);
              auVar67 = vminps_avx(auVar68,auVar67);
              auVar64 = vmaxps_avx(auVar68,auVar64);
              auVar68 = vshufpd_avx(auVar67,auVar67,3);
              auVar48 = vshufpd_avx(auVar64,auVar64,3);
              auVar67 = vminps_avx(auVar67,auVar68);
              auVar64 = vmaxps_avx(auVar64,auVar48);
              fVar231 = auVar53._0_4_;
              auVar206._0_4_ = auVar67._0_4_ * fVar231;
              auVar206._4_4_ = auVar67._4_4_ * fVar231;
              auVar206._8_4_ = auVar67._8_4_ * fVar231;
              auVar206._12_4_ = auVar67._12_4_ * fVar231;
              auVar193._0_4_ = fVar231 * auVar64._0_4_;
              auVar193._4_4_ = fVar231 * auVar64._4_4_;
              auVar193._8_4_ = fVar231 * auVar64._8_4_;
              auVar193._12_4_ = fVar231 * auVar64._12_4_;
              auVar53 = vdivss_avx512f(auVar54,ZEXT416((uint)(auVar69._0_4_ - auVar63._0_4_)));
              auVar64 = vshufpd_avx(auVar50,auVar50,3);
              auVar67 = vshufpd_avx(auVar49,auVar49,3);
              auVar68 = vshufpd_avx(auVar51,auVar51,3);
              auVar48 = vshufpd_avx(auVar52,auVar52,3);
              auVar64 = vsubps_avx(auVar64,auVar50);
              auVar50 = vsubps_avx(auVar67,auVar49);
              auVar49 = vsubps_avx(auVar68,auVar51);
              auVar48 = vsubps_avx(auVar48,auVar52);
              auVar67 = vminps_avx(auVar64,auVar50);
              auVar64 = vmaxps_avx(auVar64,auVar50);
              auVar68 = vminps_avx(auVar49,auVar48);
              auVar68 = vminps_avx(auVar67,auVar68);
              auVar67 = vmaxps_avx(auVar49,auVar48);
              auVar64 = vmaxps_avx(auVar64,auVar67);
              fVar231 = auVar53._0_4_;
              auVar236._0_4_ = fVar231 * auVar68._0_4_;
              auVar236._4_4_ = fVar231 * auVar68._4_4_;
              auVar236._8_4_ = fVar231 * auVar68._8_4_;
              auVar236._12_4_ = fVar231 * auVar68._12_4_;
              auVar221._0_4_ = fVar231 * auVar64._0_4_;
              auVar221._4_4_ = fVar231 * auVar64._4_4_;
              auVar221._8_4_ = fVar231 * auVar64._8_4_;
              auVar221._12_4_ = fVar231 * auVar64._12_4_;
              auVar48 = vinsertps_avx(auVar46,auVar63,0x10);
              auVar70 = vpermt2ps_avx512vl(auVar46,_DAT_01feecd0,auVar69);
              auVar119._0_4_ = auVar48._0_4_ + auVar70._0_4_;
              auVar119._4_4_ = auVar48._4_4_ + auVar70._4_4_;
              auVar119._8_4_ = auVar48._8_4_ + auVar70._8_4_;
              auVar119._12_4_ = auVar48._12_4_ + auVar70._12_4_;
              auVar24._8_4_ = 0x3f000000;
              auVar24._0_8_ = 0x3f0000003f000000;
              auVar24._12_4_ = 0x3f000000;
              auVar53 = vmulps_avx512vl(auVar119,auVar24);
              auVar67 = vshufps_avx(auVar53,auVar53,0x54);
              uVar107 = auVar53._0_4_;
              auVar123._4_4_ = uVar107;
              auVar123._0_4_ = uVar107;
              auVar123._8_4_ = uVar107;
              auVar123._12_4_ = uVar107;
              auVar50 = vfmadd213ps_avx512vl(local_290,auVar123,auVar57);
              auVar49 = vfmadd213ps_avx512vl(local_2a0,auVar123,auVar56);
              auVar68 = vfmadd213ps_fma(local_2b0,auVar123,local_440);
              auVar64 = vsubps_avx(auVar49,auVar50);
              auVar50 = vfmadd213ps_fma(auVar64,auVar123,auVar50);
              auVar64 = vsubps_avx(auVar68,auVar49);
              auVar64 = vfmadd213ps_fma(auVar64,auVar123,auVar49);
              auVar64 = vsubps_avx(auVar64,auVar50);
              auVar68 = vfmadd231ps_fma(auVar50,auVar64,auVar123);
              auVar51 = vmulps_avx512vl(auVar64,auVar59);
              auVar245._8_8_ = auVar68._0_8_;
              auVar245._0_8_ = auVar68._0_8_;
              auVar64 = vshufpd_avx(auVar68,auVar68,3);
              auVar68 = vshufps_avx(auVar53,auVar53,0x55);
              auVar50 = vsubps_avx(auVar64,auVar245);
              auVar49 = vfmadd231ps_fma(auVar245,auVar68,auVar50);
              auVar257._8_8_ = auVar51._0_8_;
              auVar257._0_8_ = auVar51._0_8_;
              auVar64 = vshufpd_avx(auVar51,auVar51,3);
              auVar64 = vsubps_avx512vl(auVar64,auVar257);
              auVar64 = vfmadd213ps_avx512vl(auVar64,auVar68,auVar257);
              auVar124._0_8_ = auVar50._0_8_ ^ 0x8000000080000000;
              auVar124._8_4_ = auVar50._8_4_ ^ 0x80000000;
              auVar124._12_4_ = auVar50._12_4_ ^ 0x80000000;
              auVar68 = vmovshdup_avx512vl(auVar64);
              auVar258._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
              auVar258._8_4_ = auVar68._8_4_ ^ 0x80000000;
              auVar258._12_4_ = auVar68._12_4_ ^ 0x80000000;
              auVar51 = vmovshdup_avx512vl(auVar50);
              auVar52 = vpermt2ps_avx512vl(auVar258,ZEXT416(5),auVar50);
              auVar68 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar68._0_4_ * auVar50._0_4_)),auVar64,
                                            auVar51);
              auVar50 = vpermt2ps_avx512vl(auVar64,SUB6416(ZEXT464(4),0),auVar124);
              auVar155._0_4_ = auVar68._0_4_;
              auVar155._4_4_ = auVar155._0_4_;
              auVar155._8_4_ = auVar155._0_4_;
              auVar155._12_4_ = auVar155._0_4_;
              auVar64 = vdivps_avx(auVar52,auVar155);
              auVar71 = vdivps_avx512vl(auVar50,auVar155);
              fVar231 = auVar49._0_4_;
              auVar68 = vshufps_avx(auVar49,auVar49,0x55);
              auVar246._0_4_ = fVar231 * auVar64._0_4_ + auVar68._0_4_ * auVar71._0_4_;
              auVar246._4_4_ = fVar231 * auVar64._4_4_ + auVar68._4_4_ * auVar71._4_4_;
              auVar246._8_4_ = fVar231 * auVar64._8_4_ + auVar68._8_4_ * auVar71._8_4_;
              auVar246._12_4_ = fVar231 * auVar64._12_4_ + auVar68._12_4_ * auVar71._12_4_;
              auVar55 = vsubps_avx(auVar67,auVar246);
              auVar68 = vmovshdup_avx(auVar64);
              auVar67 = vinsertps_avx(auVar206,auVar236,0x1c);
              auVar259._0_4_ = auVar68._0_4_ * auVar67._0_4_;
              auVar259._4_4_ = auVar68._4_4_ * auVar67._4_4_;
              auVar259._8_4_ = auVar68._8_4_ * auVar67._8_4_;
              auVar259._12_4_ = auVar68._12_4_ * auVar67._12_4_;
              auVar62 = vinsertps_avx512f(auVar193,auVar221,0x1c);
              auVar68 = vmulps_avx512vl(auVar68,auVar62);
              auVar52 = vminps_avx512vl(auVar259,auVar68);
              auVar49 = vmaxps_avx(auVar68,auVar259);
              auVar51 = vmovshdup_avx(auVar71);
              auVar68 = vinsertps_avx(auVar236,auVar206,0x4c);
              auVar237._0_4_ = auVar51._0_4_ * auVar68._0_4_;
              auVar237._4_4_ = auVar51._4_4_ * auVar68._4_4_;
              auVar237._8_4_ = auVar51._8_4_ * auVar68._8_4_;
              auVar237._12_4_ = auVar51._12_4_ * auVar68._12_4_;
              auVar50 = vinsertps_avx(auVar221,auVar193,0x4c);
              auVar222._0_4_ = auVar51._0_4_ * auVar50._0_4_;
              auVar222._4_4_ = auVar51._4_4_ * auVar50._4_4_;
              auVar222._8_4_ = auVar51._8_4_ * auVar50._8_4_;
              auVar222._12_4_ = auVar51._12_4_ * auVar50._12_4_;
              auVar51 = vminps_avx(auVar237,auVar222);
              auVar52 = vaddps_avx512vl(auVar52,auVar51);
              auVar51 = vmaxps_avx(auVar222,auVar237);
              auVar223._0_4_ = auVar49._0_4_ + auVar51._0_4_;
              auVar223._4_4_ = auVar49._4_4_ + auVar51._4_4_;
              auVar223._8_4_ = auVar49._8_4_ + auVar51._8_4_;
              auVar223._12_4_ = auVar49._12_4_ + auVar51._12_4_;
              auVar238._8_8_ = 0x3f80000000000000;
              auVar238._0_8_ = 0x3f80000000000000;
              auVar49 = vsubps_avx(auVar238,auVar223);
              auVar51 = vsubps_avx(auVar238,auVar52);
              auVar52 = vsubps_avx(auVar48,auVar53);
              auVar53 = vsubps_avx(auVar70,auVar53);
              fVar228 = auVar52._0_4_;
              auVar260._0_4_ = fVar228 * auVar49._0_4_;
              fVar229 = auVar52._4_4_;
              auVar260._4_4_ = fVar229 * auVar49._4_4_;
              fVar230 = auVar52._8_4_;
              auVar260._8_4_ = fVar230 * auVar49._8_4_;
              fVar185 = auVar52._12_4_;
              auVar260._12_4_ = fVar185 * auVar49._12_4_;
              auVar72 = vbroadcastss_avx512vl(auVar64);
              auVar67 = vmulps_avx512vl(auVar72,auVar67);
              auVar62 = vmulps_avx512vl(auVar72,auVar62);
              auVar72 = vminps_avx512vl(auVar67,auVar62);
              auVar62 = vmaxps_avx512vl(auVar62,auVar67);
              auVar67 = vbroadcastss_avx512vl(auVar71);
              auVar68 = vmulps_avx512vl(auVar67,auVar68);
              auVar67 = vmulps_avx512vl(auVar67,auVar50);
              auVar50 = vminps_avx512vl(auVar68,auVar67);
              auVar50 = vaddps_avx512vl(auVar72,auVar50);
              auVar52 = vmulps_avx512vl(auVar52,auVar51);
              fVar231 = auVar53._0_4_;
              auVar224._0_4_ = fVar231 * auVar49._0_4_;
              fVar217 = auVar53._4_4_;
              auVar224._4_4_ = fVar217 * auVar49._4_4_;
              fVar226 = auVar53._8_4_;
              auVar224._8_4_ = fVar226 * auVar49._8_4_;
              fVar227 = auVar53._12_4_;
              auVar224._12_4_ = fVar227 * auVar49._12_4_;
              auVar239._0_4_ = fVar231 * auVar51._0_4_;
              auVar239._4_4_ = fVar217 * auVar51._4_4_;
              auVar239._8_4_ = fVar226 * auVar51._8_4_;
              auVar239._12_4_ = fVar227 * auVar51._12_4_;
              auVar67 = vmaxps_avx(auVar67,auVar68);
              auVar194._0_4_ = auVar62._0_4_ + auVar67._0_4_;
              auVar194._4_4_ = auVar62._4_4_ + auVar67._4_4_;
              auVar194._8_4_ = auVar62._8_4_ + auVar67._8_4_;
              auVar194._12_4_ = auVar62._12_4_ + auVar67._12_4_;
              auVar207._8_8_ = 0x3f800000;
              auVar207._0_8_ = 0x3f800000;
              auVar67 = vsubps_avx(auVar207,auVar194);
              auVar68 = vsubps_avx512vl(auVar207,auVar50);
              auVar253._0_4_ = fVar228 * auVar67._0_4_;
              auVar253._4_4_ = fVar229 * auVar67._4_4_;
              auVar253._8_4_ = fVar230 * auVar67._8_4_;
              auVar253._12_4_ = fVar185 * auVar67._12_4_;
              auVar247._0_4_ = fVar228 * auVar68._0_4_;
              auVar247._4_4_ = fVar229 * auVar68._4_4_;
              auVar247._8_4_ = fVar230 * auVar68._8_4_;
              auVar247._12_4_ = fVar185 * auVar68._12_4_;
              auVar195._0_4_ = fVar231 * auVar67._0_4_;
              auVar195._4_4_ = fVar217 * auVar67._4_4_;
              auVar195._8_4_ = fVar226 * auVar67._8_4_;
              auVar195._12_4_ = fVar227 * auVar67._12_4_;
              auVar208._0_4_ = fVar231 * auVar68._0_4_;
              auVar208._4_4_ = fVar217 * auVar68._4_4_;
              auVar208._8_4_ = fVar226 * auVar68._8_4_;
              auVar208._12_4_ = fVar227 * auVar68._12_4_;
              auVar67 = vminps_avx(auVar253,auVar247);
              auVar68 = vminps_avx512vl(auVar195,auVar208);
              auVar50 = vminps_avx512vl(auVar67,auVar68);
              auVar67 = vmaxps_avx(auVar247,auVar253);
              auVar68 = vmaxps_avx(auVar208,auVar195);
              auVar68 = vmaxps_avx(auVar68,auVar67);
              auVar49 = vminps_avx512vl(auVar260,auVar52);
              auVar67 = vminps_avx(auVar224,auVar239);
              auVar67 = vminps_avx(auVar49,auVar67);
              auVar67 = vhaddps_avx(auVar50,auVar67);
              auVar49 = vmaxps_avx512vl(auVar52,auVar260);
              auVar50 = vmaxps_avx(auVar239,auVar224);
              auVar50 = vmaxps_avx(auVar50,auVar49);
              auVar68 = vhaddps_avx(auVar68,auVar50);
              auVar67 = vshufps_avx(auVar67,auVar67,0xe8);
              auVar68 = vshufps_avx(auVar68,auVar68,0xe8);
              auVar196._0_4_ = auVar67._0_4_ + auVar55._0_4_;
              auVar196._4_4_ = auVar67._4_4_ + auVar55._4_4_;
              auVar196._8_4_ = auVar67._8_4_ + auVar55._8_4_;
              auVar196._12_4_ = auVar67._12_4_ + auVar55._12_4_;
              auVar209._0_4_ = auVar68._0_4_ + auVar55._0_4_;
              auVar209._4_4_ = auVar68._4_4_ + auVar55._4_4_;
              auVar209._8_4_ = auVar68._8_4_ + auVar55._8_4_;
              auVar209._12_4_ = auVar68._12_4_ + auVar55._12_4_;
              auVar67 = vmaxps_avx(auVar48,auVar196);
              auVar68 = vminps_avx(auVar209,auVar70);
              uVar3 = vcmpps_avx512vl(auVar68,auVar67,1);
              if ((uVar3 & 3) == 0) {
                uVar3 = vcmpps_avx512vl(auVar209,auVar70,1);
                uVar18 = vcmpps_avx512vl(auVar46,auVar196,1);
                if (((ushort)uVar18 & (ushort)uVar3 & 1) == 0) {
                  bVar32 = 0;
                }
                else {
                  auVar67 = vmovshdup_avx(auVar196);
                  bVar32 = auVar63._0_4_ < auVar67._0_4_ & (byte)(uVar3 >> 1) & 0x7f;
                }
                if (((3 < uVar33 || uVar8 != 0 && !bVar43) | bVar32) != 1) {
                  auVar118 = vinsertps_avx(auVar63,auVar69,0x10);
                  auVar266 = ZEXT1664(local_450);
                  goto LAB_01b908f9;
                }
                lVar36 = 200;
                do {
                  auVar46 = vsubss_avx512f(auVar54,auVar55);
                  fVar226 = auVar46._0_4_;
                  fVar231 = fVar226 * fVar226 * fVar226;
                  auVar46 = vmulss_avx512f(auVar55,ZEXT416(0x40400000));
                  fVar217 = auVar46._0_4_ * fVar226 * fVar226;
                  fVar227 = auVar55._0_4_;
                  auVar46 = vmulss_avx512f(ZEXT416((uint)(fVar227 * fVar227)),ZEXT416(0x40400000));
                  fVar226 = fVar226 * auVar46._0_4_;
                  auVar139._4_4_ = fVar231;
                  auVar139._0_4_ = fVar231;
                  auVar139._8_4_ = fVar231;
                  auVar139._12_4_ = fVar231;
                  auVar130._4_4_ = fVar217;
                  auVar130._0_4_ = fVar217;
                  auVar130._8_4_ = fVar217;
                  auVar130._12_4_ = fVar217;
                  auVar112._4_4_ = fVar226;
                  auVar112._0_4_ = fVar226;
                  auVar112._8_4_ = fVar226;
                  auVar112._12_4_ = fVar226;
                  fVar227 = fVar227 * fVar227 * fVar227;
                  auVar171._0_4_ = (float)local_280._0_4_ * fVar227;
                  auVar171._4_4_ = (float)local_280._4_4_ * fVar227;
                  auVar171._8_4_ = fStack_278 * fVar227;
                  auVar171._12_4_ = fStack_274 * fVar227;
                  auVar46 = vfmadd231ps_fma(auVar171,local_440,auVar112);
                  auVar46 = vfmadd231ps_fma(auVar46,auVar56,auVar130);
                  auVar46 = vfmadd231ps_fma(auVar46,auVar57,auVar139);
                  auVar113._8_8_ = auVar46._0_8_;
                  auVar113._0_8_ = auVar46._0_8_;
                  auVar46 = vshufpd_avx(auVar46,auVar46,3);
                  auVar67 = vshufps_avx(auVar55,auVar55,0x55);
                  auVar46 = vsubps_avx(auVar46,auVar113);
                  auVar67 = vfmadd213ps_fma(auVar46,auVar67,auVar113);
                  fVar231 = auVar67._0_4_;
                  auVar46 = vshufps_avx(auVar67,auVar67,0x55);
                  auVar114._0_4_ = auVar64._0_4_ * fVar231 + auVar71._0_4_ * auVar46._0_4_;
                  auVar114._4_4_ = auVar64._4_4_ * fVar231 + auVar71._4_4_ * auVar46._4_4_;
                  auVar114._8_4_ = auVar64._8_4_ * fVar231 + auVar71._8_4_ * auVar46._8_4_;
                  auVar114._12_4_ = auVar64._12_4_ * fVar231 + auVar71._12_4_ * auVar46._12_4_;
                  auVar55 = vsubps_avx(auVar55,auVar114);
                  auVar46 = vandps_avx512vl(auVar67,auVar265._0_16_);
                  auVar67 = vprolq_avx512vl(auVar46,0x20);
                  auVar46 = vmaxss_avx(auVar67,auVar46);
                  bVar43 = (float)local_270._0_4_ < auVar46._0_4_;
                  if (auVar46._0_4_ < (float)local_270._0_4_) {
                    auVar46 = vucomiss_avx512f(auVar58);
                    if (bVar43) break;
                    auVar64 = vucomiss_avx512f(auVar46);
                    auVar267 = ZEXT1664(auVar64);
                    if (bVar43) break;
                    vmovshdup_avx(auVar46);
                    auVar64 = vucomiss_avx512f(auVar58);
                    if (bVar43) break;
                    auVar67 = vucomiss_avx512f(auVar64);
                    auVar267 = ZEXT1664(auVar67);
                    if (bVar43) break;
                    auVar68 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar54 = vinsertps_avx(auVar68,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar68 = vdpps_avx(auVar54,local_2c0,0x7f);
                    auVar48 = vdpps_avx(auVar54,local_2d0,0x7f);
                    auVar50 = vdpps_avx(auVar54,local_2e0,0x7f);
                    auVar49 = vdpps_avx(auVar54,local_2f0,0x7f);
                    auVar51 = vdpps_avx(auVar54,local_300,0x7f);
                    auVar52 = vdpps_avx(auVar54,local_310,0x7f);
                    auVar53 = vdpps_avx(auVar54,local_320,0x7f);
                    auVar54 = vdpps_avx(auVar54,local_330,0x7f);
                    auVar55 = vsubss_avx512f(auVar67,auVar64);
                    fVar227 = auVar64._0_4_;
                    auVar64 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * auVar51._0_4_)),auVar55,
                                              auVar68);
                    auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * fVar227)),auVar55,
                                              auVar48);
                    auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * fVar227)),auVar55,
                                              auVar50);
                    auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * auVar54._0_4_)),auVar55,
                                              auVar49);
                    auVar67 = vsubss_avx512f(auVar67,auVar46);
                    auVar183._0_4_ = auVar67._0_4_;
                    fVar231 = auVar183._0_4_ * auVar183._0_4_ * auVar183._0_4_;
                    auVar67 = vmulss_avx512f(auVar46,ZEXT416(0x40400000));
                    fVar217 = auVar67._0_4_ * auVar183._0_4_ * auVar183._0_4_;
                    local_120 = auVar46._0_4_;
                    auVar172._0_4_ = local_120 * local_120;
                    auVar172._4_4_ = auVar46._4_4_ * auVar46._4_4_;
                    auVar172._8_4_ = auVar46._8_4_ * auVar46._8_4_;
                    auVar172._12_4_ = auVar46._12_4_ * auVar46._12_4_;
                    auVar67 = vmulss_avx512f(auVar172,ZEXT416(0x40400000));
                    fVar226 = auVar183._0_4_ * auVar67._0_4_;
                    fVar229 = local_120 * auVar172._0_4_;
                    auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar229 * auVar50._0_4_)),
                                              ZEXT416((uint)fVar226),auVar48);
                    auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)fVar217),auVar68);
                    auVar64 = vfmadd231ss_fma(auVar67,ZEXT416((uint)fVar231),auVar64);
                    fVar228 = auVar64._0_4_;
                    if ((fVar228 < fVar106) ||
                       (fVar230 = *(float *)(ray + k * 4 + 0x100), fVar230 < fVar228)) break;
                    auVar64 = vshufps_avx(auVar46,auVar46,0x55);
                    auVar210._8_4_ = 0x3f800000;
                    auVar210._0_8_ = 0x3f8000003f800000;
                    auVar210._12_4_ = 0x3f800000;
                    auVar67 = vsubps_avx(auVar210,auVar64);
                    fVar185 = auVar64._0_4_;
                    auVar215._0_4_ = fVar185 * (float)local_380._0_4_;
                    fVar200 = auVar64._4_4_;
                    auVar215._4_4_ = fVar200 * (float)local_380._4_4_;
                    fVar201 = auVar64._8_4_;
                    auVar215._8_4_ = fVar201 * fStack_378;
                    fVar202 = auVar64._12_4_;
                    auVar215._12_4_ = fVar202 * fStack_374;
                    auVar225._0_4_ = fVar185 * (float)local_390._0_4_;
                    auVar225._4_4_ = fVar200 * (float)local_390._4_4_;
                    auVar225._8_4_ = fVar201 * fStack_388;
                    auVar225._12_4_ = fVar202 * fStack_384;
                    auVar240._0_4_ = fVar185 * (float)local_3a0._0_4_;
                    auVar240._4_4_ = fVar200 * (float)local_3a0._4_4_;
                    auVar240._8_4_ = fVar201 * fStack_398;
                    auVar240._12_4_ = fVar202 * fStack_394;
                    auVar197._0_4_ = fVar185 * (float)local_3b0._0_4_;
                    auVar197._4_4_ = fVar200 * (float)local_3b0._4_4_;
                    auVar197._8_4_ = fVar201 * fStack_3a8;
                    auVar197._12_4_ = fVar202 * fStack_3a4;
                    auVar64 = vfmadd231ps_fma(auVar215,auVar67,local_340);
                    auVar68 = vfmadd231ps_fma(auVar225,auVar67,local_350);
                    auVar48 = vfmadd231ps_fma(auVar240,auVar67,local_360);
                    auVar50 = vfmadd231ps_fma(auVar197,auVar67,local_370);
                    auVar64 = vsubps_avx(auVar68,auVar64);
                    auVar67 = vsubps_avx(auVar48,auVar68);
                    auVar68 = vsubps_avx(auVar50,auVar48);
                    auVar241._0_4_ = local_120 * auVar67._0_4_;
                    auVar241._4_4_ = local_120 * auVar67._4_4_;
                    auVar241._8_4_ = local_120 * auVar67._8_4_;
                    auVar241._12_4_ = local_120 * auVar67._12_4_;
                    auVar183._4_4_ = auVar183._0_4_;
                    auVar183._8_4_ = auVar183._0_4_;
                    auVar183._12_4_ = auVar183._0_4_;
                    auVar64 = vfmadd231ps_fma(auVar241,auVar183,auVar64);
                    auVar198._0_4_ = local_120 * auVar68._0_4_;
                    auVar198._4_4_ = local_120 * auVar68._4_4_;
                    auVar198._8_4_ = local_120 * auVar68._8_4_;
                    auVar198._12_4_ = local_120 * auVar68._12_4_;
                    auVar67 = vfmadd231ps_fma(auVar198,auVar183,auVar67);
                    auVar199._0_4_ = local_120 * auVar67._0_4_;
                    auVar199._4_4_ = local_120 * auVar67._4_4_;
                    auVar199._8_4_ = local_120 * auVar67._8_4_;
                    auVar199._12_4_ = local_120 * auVar67._12_4_;
                    auVar64 = vfmadd231ps_fma(auVar199,auVar183,auVar64);
                    auVar59 = vmulps_avx512vl(auVar64,auVar59);
                    pGVar9 = (context->scene->geometries).items[uVar40].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar173._0_4_ = fVar229 * (float)local_3f0._0_4_;
                    auVar173._4_4_ = fVar229 * (float)local_3f0._4_4_;
                    auVar173._8_4_ = fVar229 * fStack_3e8;
                    auVar173._12_4_ = fVar229 * fStack_3e4;
                    auVar156._4_4_ = fVar226;
                    auVar156._0_4_ = fVar226;
                    auVar156._8_4_ = fVar226;
                    auVar156._12_4_ = fVar226;
                    auVar64 = vfmadd132ps_fma(auVar156,auVar173,local_3e0);
                    auVar140._4_4_ = fVar217;
                    auVar140._0_4_ = fVar217;
                    auVar140._8_4_ = fVar217;
                    auVar140._12_4_ = fVar217;
                    auVar64 = vfmadd132ps_fma(auVar140,auVar64,local_3d0);
                    auVar131._4_4_ = fVar231;
                    auVar131._0_4_ = fVar231;
                    auVar131._8_4_ = fVar231;
                    auVar131._12_4_ = fVar231;
                    auVar68 = vfmadd132ps_fma(auVar131,auVar64,local_3c0);
                    auVar64 = vshufps_avx(auVar68,auVar68,0xc9);
                    auVar67 = vshufps_avx(auVar59,auVar59,0xc9);
                    auVar132._0_4_ = auVar68._0_4_ * auVar67._0_4_;
                    auVar132._4_4_ = auVar68._4_4_ * auVar67._4_4_;
                    auVar132._8_4_ = auVar68._8_4_ * auVar67._8_4_;
                    auVar132._12_4_ = auVar68._12_4_ * auVar67._12_4_;
                    auVar59 = vfmsub231ps_fma(auVar132,auVar59,auVar64);
                    local_140 = auVar59._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar228;
                      uVar107 = vextractps_avx(auVar59,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar107;
                      uVar107 = vextractps_avx(auVar59,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar107;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                      *(float *)(ray + k * 4 + 0x1e0) = local_120;
                      *(float *)(ray + k * 4 + 0x200) = fVar227;
                      *(uint *)(ray + k * 4 + 0x220) = uVar7;
                      *(uint *)(ray + k * 4 + 0x240) = uVar40;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    auVar141._8_4_ = 1;
                    auVar141._0_8_ = 0x100000001;
                    auVar141._12_4_ = 1;
                    auVar141._16_4_ = 1;
                    auVar141._20_4_ = 1;
                    auVar141._24_4_ = 1;
                    auVar141._28_4_ = 1;
                    local_100 = vpermps_avx2(auVar141,ZEXT1632(auVar46));
                    auVar90 = vpermps_avx2(auVar141,ZEXT1632(auVar59));
                    auVar157._8_4_ = 2;
                    auVar157._0_8_ = 0x200000002;
                    auVar157._12_4_ = 2;
                    auVar157._16_4_ = 2;
                    auVar157._20_4_ = 2;
                    auVar157._24_4_ = 2;
                    auVar157._28_4_ = 2;
                    local_160 = vpermps_avx2(auVar157,ZEXT1632(auVar59));
                    local_180[0] = (RTCHitN)auVar90[0];
                    local_180[1] = (RTCHitN)auVar90[1];
                    local_180[2] = (RTCHitN)auVar90[2];
                    local_180[3] = (RTCHitN)auVar90[3];
                    local_180[4] = (RTCHitN)auVar90[4];
                    local_180[5] = (RTCHitN)auVar90[5];
                    local_180[6] = (RTCHitN)auVar90[6];
                    local_180[7] = (RTCHitN)auVar90[7];
                    local_180[8] = (RTCHitN)auVar90[8];
                    local_180[9] = (RTCHitN)auVar90[9];
                    local_180[10] = (RTCHitN)auVar90[10];
                    local_180[0xb] = (RTCHitN)auVar90[0xb];
                    local_180[0xc] = (RTCHitN)auVar90[0xc];
                    local_180[0xd] = (RTCHitN)auVar90[0xd];
                    local_180[0xe] = (RTCHitN)auVar90[0xe];
                    local_180[0xf] = (RTCHitN)auVar90[0xf];
                    local_180[0x10] = (RTCHitN)auVar90[0x10];
                    local_180[0x11] = (RTCHitN)auVar90[0x11];
                    local_180[0x12] = (RTCHitN)auVar90[0x12];
                    local_180[0x13] = (RTCHitN)auVar90[0x13];
                    local_180[0x14] = (RTCHitN)auVar90[0x14];
                    local_180[0x15] = (RTCHitN)auVar90[0x15];
                    local_180[0x16] = (RTCHitN)auVar90[0x16];
                    local_180[0x17] = (RTCHitN)auVar90[0x17];
                    local_180[0x18] = (RTCHitN)auVar90[0x18];
                    local_180[0x19] = (RTCHitN)auVar90[0x19];
                    local_180[0x1a] = (RTCHitN)auVar90[0x1a];
                    local_180[0x1b] = (RTCHitN)auVar90[0x1b];
                    local_180[0x1c] = (RTCHitN)auVar90[0x1c];
                    local_180[0x1d] = (RTCHitN)auVar90[0x1d];
                    local_180[0x1e] = (RTCHitN)auVar90[0x1e];
                    local_180[0x1f] = (RTCHitN)auVar90[0x1f];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    fStack_11c = local_120;
                    fStack_118 = local_120;
                    fStack_114 = local_120;
                    fStack_110 = local_120;
                    fStack_10c = local_120;
                    fStack_108 = local_120;
                    fStack_104 = local_120;
                    local_e0 = local_200._0_8_;
                    uStack_d8 = local_200._8_8_;
                    uStack_d0 = local_200._16_8_;
                    uStack_c8 = local_200._24_8_;
                    local_c0 = local_1e0;
                    vpcmpeqd_avx2(local_1e0,local_1e0);
                    uStack_9c = context->user->instID[0];
                    local_a0 = uStack_9c;
                    uStack_98 = uStack_9c;
                    uStack_94 = uStack_9c;
                    uStack_90 = uStack_9c;
                    uStack_8c = uStack_9c;
                    uStack_88 = uStack_9c;
                    uStack_84 = uStack_9c;
                    uStack_7c = context->user->instPrimID[0];
                    local_80 = uStack_7c;
                    uStack_78 = uStack_7c;
                    uStack_74 = uStack_7c;
                    uStack_70 = uStack_7c;
                    uStack_6c = uStack_7c;
                    uStack_68 = uStack_7c;
                    uStack_64 = uStack_7c;
                    *(float *)(ray + k * 4 + 0x100) = fVar228;
                    local_420 = local_220;
                    local_480.valid = (int *)local_420;
                    local_480.geometryUserPtr = pGVar9->userPtr;
                    local_480.context = context->user;
                    local_480.hit = local_180;
                    local_480.N = 8;
                    local_480.ray = (RTCRayN *)ray;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar9->intersectionFilterN)(&local_480);
                      auVar263 = ZEXT3264(_DAT_01feed20);
                      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar262 = ZEXT1664(auVar46);
                      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      in_ZMM19 = ZEXT3264(auVar90);
                      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar268 = ZEXT1664(auVar46);
                      auVar267 = ZEXT464(0x3f800000);
                      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar264 = ZEXT1664(auVar46);
                      auVar46 = vxorps_avx512vl(auVar58,auVar58);
                      auVar261 = ZEXT1664(auVar46);
                      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar265 = ZEXT1664(auVar46);
                    }
                    auVar46 = auVar261._0_16_;
                    if (local_420 != (undefined1  [32])0x0) {
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var14)(&local_480);
                        auVar263 = ZEXT3264(_DAT_01feed20);
                        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar262 = ZEXT1664(auVar58);
                        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        in_ZMM19 = ZEXT3264(auVar90);
                        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar268 = ZEXT1664(auVar58);
                        auVar267 = ZEXT464(0x3f800000);
                        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar264 = ZEXT1664(auVar58);
                        auVar46 = vxorps_avx512vl(auVar46,auVar46);
                        auVar261 = ZEXT1664(auVar46);
                        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar265 = ZEXT1664(auVar46);
                      }
                      if (local_420 != (undefined1  [32])0x0) {
                        uVar3 = vptestmd_avx512vl(local_420,local_420);
                        iVar105 = *(int *)(local_480.hit + 4);
                        iVar26 = *(int *)(local_480.hit + 8);
                        iVar27 = *(int *)(local_480.hit + 0xc);
                        iVar28 = *(int *)(local_480.hit + 0x10);
                        iVar29 = *(int *)(local_480.hit + 0x14);
                        iVar30 = *(int *)(local_480.hit + 0x18);
                        iVar31 = *(int *)(local_480.hit + 0x1c);
                        bVar32 = (byte)uVar3;
                        bVar43 = (bool)((byte)(uVar3 >> 1) & 1);
                        bVar44 = (bool)((byte)(uVar3 >> 2) & 1);
                        bVar41 = (bool)((byte)(uVar3 >> 3) & 1);
                        bVar42 = (bool)((byte)(uVar3 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                        bVar17 = SUB81(uVar3 >> 7,0);
                        *(uint *)(local_480.ray + 0x180) =
                             (uint)(bVar32 & 1) * *(int *)local_480.hit |
                             (uint)!(bool)(bVar32 & 1) * *(int *)(local_480.ray + 0x180);
                        *(uint *)(local_480.ray + 0x184) =
                             (uint)bVar43 * iVar105 |
                             (uint)!bVar43 * *(int *)(local_480.ray + 0x184);
                        *(uint *)(local_480.ray + 0x188) =
                             (uint)bVar44 * iVar26 | (uint)!bVar44 * *(int *)(local_480.ray + 0x188)
                        ;
                        *(uint *)(local_480.ray + 0x18c) =
                             (uint)bVar41 * iVar27 | (uint)!bVar41 * *(int *)(local_480.ray + 0x18c)
                        ;
                        *(uint *)(local_480.ray + 400) =
                             (uint)bVar42 * iVar28 | (uint)!bVar42 * *(int *)(local_480.ray + 400);
                        *(uint *)(local_480.ray + 0x194) =
                             (uint)bVar15 * iVar29 | (uint)!bVar15 * *(int *)(local_480.ray + 0x194)
                        ;
                        *(uint *)(local_480.ray + 0x198) =
                             (uint)bVar16 * iVar30 | (uint)!bVar16 * *(int *)(local_480.ray + 0x198)
                        ;
                        *(uint *)(local_480.ray + 0x19c) =
                             (uint)bVar17 * iVar31 | (uint)!bVar17 * *(int *)(local_480.ray + 0x19c)
                        ;
                        iVar105 = *(int *)(local_480.hit + 0x24);
                        iVar26 = *(int *)(local_480.hit + 0x28);
                        iVar27 = *(int *)(local_480.hit + 0x2c);
                        iVar28 = *(int *)(local_480.hit + 0x30);
                        iVar29 = *(int *)(local_480.hit + 0x34);
                        iVar30 = *(int *)(local_480.hit + 0x38);
                        iVar31 = *(int *)(local_480.hit + 0x3c);
                        bVar43 = (bool)((byte)(uVar3 >> 1) & 1);
                        bVar44 = (bool)((byte)(uVar3 >> 2) & 1);
                        bVar41 = (bool)((byte)(uVar3 >> 3) & 1);
                        bVar42 = (bool)((byte)(uVar3 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                        bVar17 = SUB81(uVar3 >> 7,0);
                        *(uint *)(local_480.ray + 0x1a0) =
                             (uint)(bVar32 & 1) * *(int *)(local_480.hit + 0x20) |
                             (uint)!(bool)(bVar32 & 1) * *(int *)(local_480.ray + 0x1a0);
                        *(uint *)(local_480.ray + 0x1a4) =
                             (uint)bVar43 * iVar105 |
                             (uint)!bVar43 * *(int *)(local_480.ray + 0x1a4);
                        *(uint *)(local_480.ray + 0x1a8) =
                             (uint)bVar44 * iVar26 | (uint)!bVar44 * *(int *)(local_480.ray + 0x1a8)
                        ;
                        *(uint *)(local_480.ray + 0x1ac) =
                             (uint)bVar41 * iVar27 | (uint)!bVar41 * *(int *)(local_480.ray + 0x1ac)
                        ;
                        *(uint *)(local_480.ray + 0x1b0) =
                             (uint)bVar42 * iVar28 | (uint)!bVar42 * *(int *)(local_480.ray + 0x1b0)
                        ;
                        *(uint *)(local_480.ray + 0x1b4) =
                             (uint)bVar15 * iVar29 | (uint)!bVar15 * *(int *)(local_480.ray + 0x1b4)
                        ;
                        *(uint *)(local_480.ray + 0x1b8) =
                             (uint)bVar16 * iVar30 | (uint)!bVar16 * *(int *)(local_480.ray + 0x1b8)
                        ;
                        *(uint *)(local_480.ray + 0x1bc) =
                             (uint)bVar17 * iVar31 | (uint)!bVar17 * *(int *)(local_480.ray + 0x1bc)
                        ;
                        iVar105 = *(int *)(local_480.hit + 0x44);
                        iVar26 = *(int *)(local_480.hit + 0x48);
                        iVar27 = *(int *)(local_480.hit + 0x4c);
                        iVar28 = *(int *)(local_480.hit + 0x50);
                        iVar29 = *(int *)(local_480.hit + 0x54);
                        iVar30 = *(int *)(local_480.hit + 0x58);
                        iVar31 = *(int *)(local_480.hit + 0x5c);
                        bVar43 = (bool)((byte)(uVar3 >> 1) & 1);
                        bVar44 = (bool)((byte)(uVar3 >> 2) & 1);
                        bVar41 = (bool)((byte)(uVar3 >> 3) & 1);
                        bVar42 = (bool)((byte)(uVar3 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                        bVar17 = SUB81(uVar3 >> 7,0);
                        *(uint *)(local_480.ray + 0x1c0) =
                             (uint)(bVar32 & 1) * *(int *)(local_480.hit + 0x40) |
                             (uint)!(bool)(bVar32 & 1) * *(int *)(local_480.ray + 0x1c0);
                        *(uint *)(local_480.ray + 0x1c4) =
                             (uint)bVar43 * iVar105 |
                             (uint)!bVar43 * *(int *)(local_480.ray + 0x1c4);
                        *(uint *)(local_480.ray + 0x1c8) =
                             (uint)bVar44 * iVar26 | (uint)!bVar44 * *(int *)(local_480.ray + 0x1c8)
                        ;
                        *(uint *)(local_480.ray + 0x1cc) =
                             (uint)bVar41 * iVar27 | (uint)!bVar41 * *(int *)(local_480.ray + 0x1cc)
                        ;
                        *(uint *)(local_480.ray + 0x1d0) =
                             (uint)bVar42 * iVar28 | (uint)!bVar42 * *(int *)(local_480.ray + 0x1d0)
                        ;
                        *(uint *)(local_480.ray + 0x1d4) =
                             (uint)bVar15 * iVar29 | (uint)!bVar15 * *(int *)(local_480.ray + 0x1d4)
                        ;
                        *(uint *)(local_480.ray + 0x1d8) =
                             (uint)bVar16 * iVar30 | (uint)!bVar16 * *(int *)(local_480.ray + 0x1d8)
                        ;
                        *(uint *)(local_480.ray + 0x1dc) =
                             (uint)bVar17 * iVar31 | (uint)!bVar17 * *(int *)(local_480.ray + 0x1dc)
                        ;
                        iVar105 = *(int *)(local_480.hit + 100);
                        iVar26 = *(int *)(local_480.hit + 0x68);
                        iVar27 = *(int *)(local_480.hit + 0x6c);
                        iVar28 = *(int *)(local_480.hit + 0x70);
                        iVar29 = *(int *)(local_480.hit + 0x74);
                        iVar30 = *(int *)(local_480.hit + 0x78);
                        iVar31 = *(int *)(local_480.hit + 0x7c);
                        bVar43 = (bool)((byte)(uVar3 >> 1) & 1);
                        bVar44 = (bool)((byte)(uVar3 >> 2) & 1);
                        bVar41 = (bool)((byte)(uVar3 >> 3) & 1);
                        bVar42 = (bool)((byte)(uVar3 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                        bVar17 = SUB81(uVar3 >> 7,0);
                        *(uint *)(local_480.ray + 0x1e0) =
                             (uint)(bVar32 & 1) * *(int *)(local_480.hit + 0x60) |
                             (uint)!(bool)(bVar32 & 1) * *(int *)(local_480.ray + 0x1e0);
                        *(uint *)(local_480.ray + 0x1e4) =
                             (uint)bVar43 * iVar105 |
                             (uint)!bVar43 * *(int *)(local_480.ray + 0x1e4);
                        *(uint *)(local_480.ray + 0x1e8) =
                             (uint)bVar44 * iVar26 | (uint)!bVar44 * *(int *)(local_480.ray + 0x1e8)
                        ;
                        *(uint *)(local_480.ray + 0x1ec) =
                             (uint)bVar41 * iVar27 | (uint)!bVar41 * *(int *)(local_480.ray + 0x1ec)
                        ;
                        *(uint *)(local_480.ray + 0x1f0) =
                             (uint)bVar42 * iVar28 | (uint)!bVar42 * *(int *)(local_480.ray + 0x1f0)
                        ;
                        *(uint *)(local_480.ray + 500) =
                             (uint)bVar15 * iVar29 | (uint)!bVar15 * *(int *)(local_480.ray + 500);
                        *(uint *)(local_480.ray + 0x1f8) =
                             (uint)bVar16 * iVar30 | (uint)!bVar16 * *(int *)(local_480.ray + 0x1f8)
                        ;
                        *(uint *)(local_480.ray + 0x1fc) =
                             (uint)bVar17 * iVar31 | (uint)!bVar17 * *(int *)(local_480.ray + 0x1fc)
                        ;
                        iVar105 = *(int *)(local_480.hit + 0x84);
                        iVar26 = *(int *)(local_480.hit + 0x88);
                        iVar27 = *(int *)(local_480.hit + 0x8c);
                        iVar28 = *(int *)(local_480.hit + 0x90);
                        iVar29 = *(int *)(local_480.hit + 0x94);
                        iVar30 = *(int *)(local_480.hit + 0x98);
                        iVar31 = *(int *)(local_480.hit + 0x9c);
                        bVar43 = (bool)((byte)(uVar3 >> 1) & 1);
                        bVar44 = (bool)((byte)(uVar3 >> 2) & 1);
                        bVar41 = (bool)((byte)(uVar3 >> 3) & 1);
                        bVar42 = (bool)((byte)(uVar3 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                        bVar17 = SUB81(uVar3 >> 7,0);
                        *(uint *)(local_480.ray + 0x200) =
                             (uint)(bVar32 & 1) * *(int *)(local_480.hit + 0x80) |
                             (uint)!(bool)(bVar32 & 1) * *(int *)(local_480.ray + 0x200);
                        *(uint *)(local_480.ray + 0x204) =
                             (uint)bVar43 * iVar105 |
                             (uint)!bVar43 * *(int *)(local_480.ray + 0x204);
                        *(uint *)(local_480.ray + 0x208) =
                             (uint)bVar44 * iVar26 | (uint)!bVar44 * *(int *)(local_480.ray + 0x208)
                        ;
                        *(uint *)(local_480.ray + 0x20c) =
                             (uint)bVar41 * iVar27 | (uint)!bVar41 * *(int *)(local_480.ray + 0x20c)
                        ;
                        *(uint *)(local_480.ray + 0x210) =
                             (uint)bVar42 * iVar28 | (uint)!bVar42 * *(int *)(local_480.ray + 0x210)
                        ;
                        *(uint *)(local_480.ray + 0x214) =
                             (uint)bVar15 * iVar29 | (uint)!bVar15 * *(int *)(local_480.ray + 0x214)
                        ;
                        *(uint *)(local_480.ray + 0x218) =
                             (uint)bVar16 * iVar30 | (uint)!bVar16 * *(int *)(local_480.ray + 0x218)
                        ;
                        *(uint *)(local_480.ray + 0x21c) =
                             (uint)bVar17 * iVar31 | (uint)!bVar17 * *(int *)(local_480.ray + 0x21c)
                        ;
                        auVar90 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0xa0));
                        *(undefined1 (*) [32])(local_480.ray + 0x220) = auVar90;
                        auVar90 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0xc0));
                        *(undefined1 (*) [32])(local_480.ray + 0x240) = auVar90;
                        auVar90 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0xe0));
                        *(undefined1 (*) [32])(local_480.ray + 0x260) = auVar90;
                        auVar90 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0x100));
                        *(undefined1 (*) [32])(local_480.ray + 0x280) = auVar90;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar230;
                    break;
                  }
                  lVar36 = lVar36 + -1;
                } while (lVar36 != 0);
              }
            }
          }
          auVar266 = ZEXT1664(local_450);
          if (uVar33 == 0) break;
        } while( true );
      }
      uVar107 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar25._4_4_ = uVar107;
      auVar25._0_4_ = uVar107;
      auVar25._8_4_ = uVar107;
      auVar25._12_4_ = uVar107;
      uVar18 = vcmpps_avx512vl(local_400,auVar25,2);
      uVar40 = (uint)uVar45 & (uint)uVar45 + 0xf & (uint)uVar18;
      uVar45 = (ulong)uVar40;
    } while (uVar40 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }